

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 *paVar5;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 *paVar6;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 *paVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  Primitive PVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  RTCFilterFunctionN p_Var29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  unkbyte9 Var83;
  undefined1 auVar84 [13];
  undefined1 auVar85 [12];
  undefined1 auVar86 [13];
  undefined1 auVar87 [12];
  undefined1 auVar88 [13];
  undefined1 auVar89 [12];
  undefined1 auVar90 [13];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined6 uVar93;
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [13];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  vfloat_impl<4> vVar107;
  undefined4 uVar108;
  ulong uVar111;
  StackEntry *pSVar112;
  long extraout_RAX;
  uint uVar109;
  undefined4 uVar110;
  RTCRayN *pRVar113;
  long extraout_RAX_00;
  long lVar114;
  RTCIntersectArguments *pRVar115;
  RTCIntersectArguments *pRVar116;
  ulong uVar117;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  uint uVar118;
  ulong uVar119;
  long lVar120;
  ulong uVar121;
  byte bVar122;
  bool bVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  short sVar132;
  int iVar133;
  float fVar134;
  undefined1 auVar136 [12];
  undefined8 uVar135;
  __m128 a_1;
  int iVar190;
  char cVar194;
  undefined1 auVar140 [16];
  undefined1 auVar138 [12];
  undefined1 auVar144 [16];
  undefined1 auVar139 [12];
  undefined1 auVar148 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  float fVar195;
  float fVar197;
  float fVar198;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar193;
  float fVar196;
  float fVar199;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar188;
  float fVar200;
  float fVar226;
  float fVar228;
  vfloat_impl<4> t;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar227;
  float fVar229;
  float fVar230;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  char cVar231;
  char cVar255;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar256;
  float fVar258;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar257;
  float fVar259;
  float fVar260;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar261;
  char cVar279;
  undefined1 uVar280;
  float fVar282;
  float fVar283;
  vfloat4 a;
  undefined1 uVar281;
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar284;
  undefined1 auVar285 [12];
  float fVar303;
  float fVar304;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar286 [12];
  undefined1 auVar292 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  char cVar334;
  float fVar305;
  undefined1 auVar307 [12];
  float fVar335;
  float fVar337;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar308 [12];
  undefined1 auVar315 [16];
  undefined1 auVar319 [16];
  float fVar306;
  float fVar336;
  float fVar338;
  float fVar339;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar322;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar350;
  float fVar353;
  float fVar356;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar351;
  float fVar352;
  float fVar354;
  float fVar355;
  float fVar357;
  float fVar358;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar362;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar363;
  float fVar364;
  float fVar365;
  uint uVar366;
  float fVar375;
  float fVar379;
  undefined1 auVar367 [16];
  float fVar376;
  float fVar377;
  float fVar380;
  float fVar381;
  float fVar383;
  float fVar384;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar373;
  uint uVar378;
  uint uVar382;
  uint uVar385;
  undefined1 auVar374 [16];
  float fVar386;
  uint uVar388;
  undefined1 auVar389 [12];
  float fVar404;
  undefined1 auVar390 [16];
  undefined1 auVar394 [16];
  float fVar407;
  float fVar410;
  undefined1 auVar397 [16];
  float fVar387;
  float fVar405;
  float fVar408;
  float fVar411;
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  uint uVar406;
  uint uVar409;
  uint uVar412;
  undefined1 auVar402 [16];
  float fVar413;
  float fVar414;
  float fVar418;
  float fVar421;
  undefined1 auVar415 [16];
  float fVar419;
  float fVar420;
  float fVar422;
  float fVar423;
  float fVar424;
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  float fVar425;
  float fVar426;
  float fVar429;
  float fVar432;
  undefined1 auVar427 [16];
  float fVar430;
  float fVar431;
  float fVar433;
  float fVar434;
  float fVar435;
  undefined1 auVar428 [16];
  float fVar444;
  undefined1 auVar436 [16];
  undefined1 auVar439 [16];
  float fVar445;
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  float fVar446;
  float fVar447;
  float fVar450;
  float fVar451;
  float fVar452;
  float fVar453;
  float fVar454;
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  float fVar455;
  float fVar456;
  float fVar464;
  float fVar466;
  float fVar468;
  undefined1 auVar457 [16];
  float fVar465;
  float fVar467;
  float fVar469;
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar461 [16];
  undefined1 auVar463 [16];
  float fVar470;
  float fVar471;
  float fVar472;
  float fVar475;
  float fVar476;
  float fVar477;
  float fVar478;
  float fVar479;
  float fVar480;
  undefined1 auVar474 [16];
  float fVar481;
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 local_6b8 [8];
  float fStack_6b0;
  float fStack_6ac;
  float fStack_660;
  float fStack_65c;
  undefined1 local_638 [8];
  uint uStack_630;
  uint uStack_62c;
  undefined1 local_618 [6];
  undefined2 uStack_612;
  float fStack_610;
  float fStack_60c;
  Vec3fa dir;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  undefined1 local_568 [16];
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined4 local_518;
  undefined4 uStack_514;
  float fStack_510;
  float fStack_50c;
  RTCFilterFunctionNArguments args;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_1d8;
  float fStack_1d4;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  undefined1 auVar137 [12];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined2 uVar189;
  int iVar191;
  int iVar192;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar289 [16];
  undefined1 auVar293 [16];
  undefined1 auVar290 [16];
  undefined1 auVar294 [16];
  undefined1 auVar291 [16];
  undefined1 auVar295 [16];
  undefined1 auVar312 [16];
  undefined1 auVar316 [16];
  undefined1 auVar326 [16];
  undefined1 auVar331 [16];
  undefined1 auVar313 [16];
  undefined1 auVar317 [16];
  undefined1 auVar314 [16];
  undefined1 auVar318 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar395 [16];
  undefined1 auVar393 [16];
  undefined1 auVar396 [16];
  int iVar403;
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar460 [16];
  undefined1 auVar462 [16];
  undefined1 auVar473 [16];
  
  PVar18 = prim[1];
  uVar111 = (ulong)(byte)PVar18;
  lVar114 = uVar111 * 0x25;
  uVar110 = *(undefined4 *)(prim + uVar111 * 4 + 6);
  uVar108 = *(undefined4 *)(prim + uVar111 * 5 + 6);
  uVar19 = *(undefined4 *)(prim + uVar111 * 6 + 6);
  uVar20 = *(undefined4 *)(prim + uVar111 * 0xf + 6);
  uVar21 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar22 = *(undefined4 *)(prim + uVar111 * 0x11 + 6);
  uVar23 = *(undefined4 *)(prim + uVar111 * 0x1a + 6);
  uVar24 = *(undefined4 *)(prim + uVar111 * 0x1b + 6);
  uVar25 = *(undefined4 *)(prim + uVar111 * 0x1c + 6);
  auVar310 = *(undefined1 (*) [16])(prim + lVar114 + 6);
  auVar249._12_4_ = auVar310._12_4_;
  auVar136._0_8_ = CONCAT44(auVar249._12_4_,auVar249._12_4_);
  auVar136._8_4_ = auVar249._12_4_;
  auVar249._0_12_ = auVar136;
  fVar284 = (*(float *)(ray + k * 4) - auVar310._0_4_) * auVar249._12_4_;
  fVar303 = (*(float *)(ray + k * 4 + 0x10) - auVar310._4_4_) * auVar249._12_4_;
  fVar304 = (*(float *)(ray + k * 4 + 0x20) - auVar310._8_4_) * auVar249._12_4_;
  fVar446 = *(float *)(ray + k * 4 + 0x40) * auVar249._12_4_;
  fVar450 = *(float *)(ray + k * 4 + 0x50) * auVar249._12_4_;
  fVar452 = *(float *)(ray + k * 4 + 0x60) * auVar249._12_4_;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar249._0_13_;
  auVar33[0xe] = auVar310[0xf];
  auVar38[0xc] = auVar310[0xe];
  auVar38._0_12_ = auVar136;
  auVar38._13_2_ = auVar33._13_2_;
  auVar43[0xb] = 0;
  auVar43._0_11_ = auVar136._0_11_;
  auVar43._12_3_ = auVar38._12_3_;
  auVar48[10] = auVar310[0xd];
  auVar48._0_10_ = auVar136._0_10_;
  auVar48._11_4_ = auVar43._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar136._0_9_;
  auVar53._10_5_ = auVar48._10_5_;
  auVar58[8] = auVar310[0xc];
  auVar58._0_8_ = auVar136._0_8_;
  auVar58._9_6_ = auVar53._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar108 >> 0x18)),auVar310[0xf]);
  auVar63._6_9_ = Var83;
  auVar63[5] = (char)((uint)uVar108 >> 0x10);
  auVar63[4] = auVar310[0xe];
  auVar63._0_4_ = auVar249._12_4_;
  cVar255 = (char)((uint)uVar108 >> 8);
  auVar84._2_11_ = auVar63._4_11_;
  auVar84[1] = cVar255;
  auVar84[0] = auVar310[0xd];
  cVar231 = (char)uVar108;
  sVar132 = CONCAT11(cVar231,auVar310[0xc]);
  auVar68._2_13_ = auVar84;
  auVar68._0_2_ = sVar132;
  uVar189 = (undefined2)Var83;
  auVar310._0_12_ = auVar68._0_12_;
  auVar310._12_2_ = uVar189;
  auVar310._14_2_ = uVar189;
  auVar399._12_4_ = auVar310._12_4_;
  auVar399._0_10_ = auVar68._0_10_;
  auVar399._10_2_ = auVar63._4_2_;
  auVar474._10_6_ = auVar399._10_6_;
  auVar474._0_8_ = auVar68._0_8_;
  auVar474._8_2_ = auVar63._4_2_;
  auVar85._4_8_ = auVar474._8_8_;
  auVar85._2_2_ = auVar84._0_2_;
  auVar85._0_2_ = auVar84._0_2_;
  iVar133 = (int)sVar132 >> 8;
  iVar190 = auVar85._0_4_ >> 0x18;
  auVar137._0_8_ = CONCAT44(iVar190,iVar133);
  auVar137._8_4_ = auVar474._8_4_ >> 0x18;
  auVar324._12_4_ = auVar399._12_4_ >> 0x18;
  auVar324._0_12_ = auVar137;
  fVar418 = (float)iVar190;
  cVar194 = cVar255 >> 7;
  auVar34[0xd] = 0;
  auVar34._0_13_ = auVar324._0_13_;
  auVar34[0xe] = cVar194;
  auVar39[0xc] = cVar194;
  auVar39._0_12_ = auVar137;
  auVar39._13_2_ = auVar34._13_2_;
  auVar44[0xb] = 0;
  auVar44._0_11_ = auVar137._0_11_;
  auVar44._12_3_ = auVar39._12_3_;
  auVar49[10] = cVar194;
  auVar49._0_10_ = auVar137._0_10_;
  auVar49._11_4_ = auVar44._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar137._0_9_;
  auVar54._10_5_ = auVar49._10_5_;
  auVar59[8] = cVar255;
  auVar59._0_8_ = auVar137._0_8_;
  auVar59._9_6_ = auVar54._9_6_;
  uVar281 = (undefined1)((uint)uVar19 >> 0x18);
  Var83 = CONCAT81(CONCAT71(auVar59._8_7_,uVar281),(short)cVar231 >> 7);
  uVar280 = (undefined1)((uint)uVar19 >> 0x10);
  auVar64._6_9_ = Var83;
  auVar64[5] = uVar280;
  auVar64[4] = (undefined1)((short)cVar231 >> 7);
  auVar64._0_4_ = iVar133;
  cVar279 = (char)((uint)uVar19 >> 8);
  auVar86._2_11_ = auVar64._4_11_;
  auVar86[1] = cVar279;
  auVar86[0] = (undefined1)((short)cVar231 >> 7);
  cVar255 = (char)uVar19;
  auVar69._2_13_ = auVar86;
  auVar69._0_2_ = CONCAT11(cVar255,cVar231);
  uVar189 = (undefined2)Var83;
  auVar142._0_12_ = auVar69._0_12_;
  auVar142._12_2_ = uVar189;
  auVar142._14_2_ = uVar189;
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._0_10_ = auVar69._0_10_;
  auVar141._10_2_ = auVar64._4_2_;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._0_8_ = auVar69._0_8_;
  auVar140._8_2_ = auVar64._4_2_;
  auVar87._4_8_ = auVar140._8_8_;
  auVar87._2_2_ = auVar86._0_2_;
  auVar87._0_2_ = auVar86._0_2_;
  iVar190 = (int)CONCAT11(cVar255,cVar231) >> 8;
  iVar191 = auVar87._0_4_ >> 0x18;
  auVar138._0_8_ = CONCAT44(iVar191,iVar190);
  auVar138._8_4_ = auVar140._8_4_ >> 0x18;
  auVar143._12_4_ = auVar141._12_4_ >> 0x18;
  auVar143._0_12_ = auVar138;
  fVar429 = (float)iVar191;
  cVar194 = cVar279 >> 7;
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar143._0_13_;
  auVar35[0xe] = cVar194;
  auVar40[0xc] = cVar194;
  auVar40._0_12_ = auVar138;
  auVar40._13_2_ = auVar35._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar138._0_11_;
  auVar45._12_3_ = auVar40._12_3_;
  auVar50[10] = cVar194;
  auVar50._0_10_ = auVar138._0_10_;
  auVar50._11_4_ = auVar45._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar138._0_9_;
  auVar55._10_5_ = auVar50._10_5_;
  auVar60[8] = cVar279;
  auVar60._0_8_ = auVar138._0_8_;
  auVar60._9_6_ = auVar55._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar255 >> 7);
  auVar65._6_9_ = Var83;
  auVar65[5] = (char)((uint)uVar21 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar255 >> 7);
  auVar65._0_4_ = iVar190;
  cVar334 = (char)((uint)uVar21 >> 8);
  auVar88._2_11_ = auVar65._4_11_;
  auVar88[1] = cVar334;
  auVar88[0] = (undefined1)((short)cVar255 >> 7);
  cVar231 = (char)uVar21;
  auVar70._2_13_ = auVar88;
  auVar70._0_2_ = CONCAT11(cVar231,cVar255);
  uVar189 = (undefined2)Var83;
  auVar146._0_12_ = auVar70._0_12_;
  auVar146._12_2_ = uVar189;
  auVar146._14_2_ = uVar189;
  auVar145._12_4_ = auVar146._12_4_;
  auVar145._0_10_ = auVar70._0_10_;
  auVar145._10_2_ = auVar65._4_2_;
  auVar144._10_6_ = auVar145._10_6_;
  auVar144._0_8_ = auVar70._0_8_;
  auVar144._8_2_ = auVar65._4_2_;
  auVar89._4_8_ = auVar144._8_8_;
  auVar89._2_2_ = auVar88._0_2_;
  auVar89._0_2_ = auVar88._0_2_;
  iVar191 = (int)CONCAT11(cVar231,cVar255) >> 8;
  iVar192 = auVar89._0_4_ >> 0x18;
  auVar139._0_8_ = CONCAT44(iVar192,iVar191);
  auVar139._8_4_ = auVar144._8_4_ >> 0x18;
  auVar147._12_4_ = auVar145._12_4_ >> 0x18;
  auVar147._0_12_ = auVar139;
  fVar362 = (float)iVar192;
  cVar194 = cVar334 >> 7;
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar147._0_13_;
  auVar36[0xe] = cVar194;
  auVar41[0xc] = cVar194;
  auVar41._0_12_ = auVar139;
  auVar41._13_2_ = auVar36._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar139._0_11_;
  auVar46._12_3_ = auVar41._12_3_;
  auVar51[10] = cVar194;
  auVar51._0_10_ = auVar139._0_10_;
  auVar51._11_4_ = auVar46._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar139._0_9_;
  auVar56._10_5_ = auVar51._10_5_;
  auVar61[8] = cVar334;
  auVar61._0_8_ = auVar139._0_8_;
  auVar61._9_6_ = auVar56._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar231 >> 7);
  auVar66._6_9_ = Var83;
  auVar66[5] = (char)((uint)uVar22 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar231 >> 7);
  auVar66._0_4_ = iVar191;
  auVar90._2_11_ = auVar66._4_11_;
  auVar90[1] = (char)((uint)uVar22 >> 8);
  auVar90[0] = (undefined1)((short)cVar231 >> 7);
  sVar132 = CONCAT11((char)uVar22,cVar231);
  auVar71._2_13_ = auVar90;
  auVar71._0_2_ = sVar132;
  uVar189 = (undefined2)Var83;
  auVar150._0_12_ = auVar71._0_12_;
  auVar150._12_2_ = uVar189;
  auVar150._14_2_ = uVar189;
  auVar149._12_4_ = auVar150._12_4_;
  auVar149._0_10_ = auVar71._0_10_;
  auVar149._10_2_ = auVar66._4_2_;
  auVar148._10_6_ = auVar149._10_6_;
  auVar148._0_8_ = auVar71._0_8_;
  auVar148._8_2_ = auVar66._4_2_;
  auVar91._4_8_ = auVar148._8_8_;
  auVar91._2_2_ = auVar90._0_2_;
  auVar91._0_2_ = auVar90._0_2_;
  fVar200 = (float)((int)sVar132 >> 8);
  fVar226 = (float)(auVar91._0_4_ >> 0x18);
  fVar228 = (float)(auVar148._8_4_ >> 0x18);
  fVar232 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar114 + 0x16)) *
            *(float *)(prim + lVar114 + 0x1a);
  dir.field_0._0_1_ = (undefined1)uVar110;
  dir.field_0._1_1_ = (undefined1)((uint)uVar110 >> 8);
  dir.field_0._2_1_ = (undefined1)((uint)uVar110 >> 0x10);
  dir.field_0._3_1_ = (undefined1)((uint)uVar110 >> 0x18);
  uVar189 = CONCAT11(dir.field_0._3_1_,uVar281);
  uVar135 = CONCAT35(CONCAT21(uVar189,dir.field_0._2_1_),CONCAT14(uVar280,uVar19));
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar135 >> 0x20),dir.field_0._1_1_),cVar279);
  uVar119 = CONCAT62(uVar93,CONCAT11(dir.field_0._0_1_,cVar255));
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar119;
  auVar264._12_2_ = uVar189;
  auVar264._14_2_ = uVar189;
  uVar189 = (undefined2)((ulong)uVar135 >> 0x20);
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._8_2_ = 0;
  auVar263._0_8_ = uVar119;
  auVar263._10_2_ = uVar189;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._8_2_ = uVar189;
  auVar262._0_8_ = uVar119;
  uVar189 = (undefined2)uVar93;
  auVar92._4_8_ = auVar262._8_8_;
  auVar92._2_2_ = uVar189;
  auVar92._0_2_ = uVar189;
  fVar340 = (float)((int)CONCAT11(dir.field_0._0_1_,cVar255) >> 8);
  fVar350 = (float)(auVar92._0_4_ >> 0x18);
  fVar353 = (float)(auVar262._8_4_ >> 0x18);
  uVar280 = (undefined1)((uint)uVar20 >> 0x18);
  uVar189 = CONCAT11(uVar280,uVar280);
  uVar280 = (undefined1)((uint)uVar20 >> 0x10);
  uVar135 = CONCAT35(CONCAT21(uVar189,uVar280),CONCAT14(uVar280,uVar20));
  uVar280 = (undefined1)((uint)uVar20 >> 8);
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar135 >> 0x20),uVar280),uVar280);
  sVar132 = CONCAT11((char)uVar20,(char)uVar20);
  uVar119 = CONCAT62(uVar93,sVar132);
  auVar438._8_4_ = 0;
  auVar438._0_8_ = uVar119;
  auVar438._12_2_ = uVar189;
  auVar438._14_2_ = uVar189;
  uVar189 = (undefined2)((ulong)uVar135 >> 0x20);
  auVar437._12_4_ = auVar438._12_4_;
  auVar437._8_2_ = 0;
  auVar437._0_8_ = uVar119;
  auVar437._10_2_ = uVar189;
  auVar436._10_6_ = auVar437._10_6_;
  auVar436._8_2_ = uVar189;
  auVar436._0_8_ = uVar119;
  uVar189 = (undefined2)uVar93;
  auVar94._4_8_ = auVar436._8_8_;
  auVar94._2_2_ = uVar189;
  auVar94._0_2_ = uVar189;
  fVar261 = (float)((int)sVar132 >> 8);
  fVar282 = (float)(auVar94._0_4_ >> 0x18);
  fVar283 = (float)(auVar436._8_4_ >> 0x18);
  uVar280 = (undefined1)((uint)uVar23 >> 0x18);
  uVar189 = CONCAT11(uVar280,uVar280);
  uVar280 = (undefined1)((uint)uVar23 >> 0x10);
  uVar135 = CONCAT35(CONCAT21(uVar189,uVar280),CONCAT14(uVar280,uVar23));
  uVar280 = (undefined1)((uint)uVar23 >> 8);
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar135 >> 0x20),uVar280),uVar280);
  sVar132 = CONCAT11((char)uVar23,(char)uVar23);
  uVar119 = CONCAT62(uVar93,sVar132);
  auVar369._8_4_ = 0;
  auVar369._0_8_ = uVar119;
  auVar369._12_2_ = uVar189;
  auVar369._14_2_ = uVar189;
  uVar189 = (undefined2)((ulong)uVar135 >> 0x20);
  auVar368._12_4_ = auVar369._12_4_;
  auVar368._8_2_ = 0;
  auVar368._0_8_ = uVar119;
  auVar368._10_2_ = uVar189;
  auVar367._10_6_ = auVar368._10_6_;
  auVar367._8_2_ = uVar189;
  auVar367._0_8_ = uVar119;
  uVar189 = (undefined2)uVar93;
  auVar95._4_8_ = auVar367._8_8_;
  auVar95._2_2_ = uVar189;
  auVar95._0_2_ = uVar189;
  fVar363 = (float)((int)sVar132 >> 8);
  fVar375 = (float)(auVar95._0_4_ >> 0x18);
  fVar379 = (float)(auVar367._8_4_ >> 0x18);
  uVar280 = (undefined1)((uint)uVar24 >> 0x18);
  uVar189 = CONCAT11(uVar280,uVar280);
  uVar280 = (undefined1)((uint)uVar24 >> 0x10);
  uVar135 = CONCAT35(CONCAT21(uVar189,uVar280),CONCAT14(uVar280,uVar24));
  cVar231 = (char)((uint)uVar24 >> 8);
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar135 >> 0x20),cVar231),cVar231);
  cVar194 = (char)uVar24;
  uVar119 = CONCAT62(uVar93,CONCAT11(cVar194,cVar194));
  auVar392._8_4_ = 0;
  auVar392._0_8_ = uVar119;
  auVar392._12_2_ = uVar189;
  auVar392._14_2_ = uVar189;
  uVar189 = (undefined2)((ulong)uVar135 >> 0x20);
  auVar391._12_4_ = auVar392._12_4_;
  auVar391._8_2_ = 0;
  auVar391._0_8_ = uVar119;
  auVar391._10_2_ = uVar189;
  auVar390._10_6_ = auVar391._10_6_;
  auVar390._8_2_ = uVar189;
  auVar390._0_8_ = uVar119;
  uVar189 = (undefined2)uVar93;
  auVar96._4_8_ = auVar390._8_8_;
  auVar96._2_2_ = uVar189;
  auVar96._0_2_ = uVar189;
  iVar192 = (int)CONCAT11(cVar194,cVar194) >> 8;
  iVar403 = auVar96._0_4_ >> 0x18;
  auVar389._0_8_ = CONCAT44(iVar403,iVar192);
  auVar389._8_4_ = auVar390._8_4_ >> 0x18;
  auVar393._12_4_ = auVar391._12_4_ >> 0x18;
  auVar393._0_12_ = auVar389;
  fVar444 = (float)iVar403;
  cVar255 = cVar231 >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar393._0_13_;
  auVar37[0xe] = cVar255;
  auVar42[0xc] = cVar255;
  auVar42._0_12_ = auVar389;
  auVar42._13_2_ = auVar37._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar389._0_11_;
  auVar47._12_3_ = auVar42._12_3_;
  auVar52[10] = cVar255;
  auVar52._0_10_ = auVar389._0_10_;
  auVar52._11_4_ = auVar47._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar389._0_9_;
  auVar57._10_5_ = auVar52._10_5_;
  auVar62[8] = cVar231;
  auVar62._0_8_ = auVar389._0_8_;
  auVar62._9_6_ = auVar57._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar194 >> 7);
  auVar67._6_9_ = Var83;
  auVar67[5] = (char)((uint)uVar25 >> 0x10);
  auVar67[4] = (undefined1)((short)cVar194 >> 7);
  auVar67._0_4_ = iVar192;
  auVar97._2_11_ = auVar67._4_11_;
  auVar97[1] = (char)((uint)uVar25 >> 8);
  auVar97[0] = (undefined1)((short)cVar194 >> 7);
  sVar132 = CONCAT11((char)uVar25,cVar194);
  auVar72._2_13_ = auVar97;
  auVar72._0_2_ = sVar132;
  uVar189 = (undefined2)Var83;
  auVar396._0_12_ = auVar72._0_12_;
  auVar396._12_2_ = uVar189;
  auVar396._14_2_ = uVar189;
  auVar395._12_4_ = auVar396._12_4_;
  auVar395._0_10_ = auVar72._0_10_;
  auVar395._10_2_ = auVar67._4_2_;
  auVar394._10_6_ = auVar395._10_6_;
  auVar394._0_8_ = auVar72._0_8_;
  auVar394._8_2_ = auVar67._4_2_;
  auVar98._4_8_ = auVar394._8_8_;
  auVar98._2_2_ = auVar97._0_2_;
  auVar98._0_2_ = auVar97._0_2_;
  fVar233 = (float)((int)sVar132 >> 8);
  fVar256 = (float)(auVar98._0_4_ >> 0x18);
  fVar258 = (float)(auVar394._8_4_ >> 0x18);
  fVar455 = fVar446 * fVar340 + fVar450 * (float)iVar133 + fVar452 * (float)iVar190;
  fVar464 = fVar446 * fVar350 + fVar450 * fVar418 + fVar452 * fVar429;
  fVar466 = fVar446 * fVar353 + fVar450 * (float)auVar137._8_4_ + fVar452 * (float)auVar138._8_4_;
  fVar468 = fVar446 * (float)(auVar263._12_4_ >> 0x18) +
            fVar450 * (float)auVar324._12_4_ + fVar452 * (float)auVar143._12_4_;
  fVar386 = fVar446 * fVar261 + fVar450 * (float)iVar191 + fVar452 * fVar200;
  fVar404 = fVar446 * fVar282 + fVar450 * fVar362 + fVar452 * fVar226;
  fVar407 = fVar446 * fVar283 + fVar450 * (float)auVar139._8_4_ + fVar452 * fVar228;
  fVar410 = fVar446 * (float)(auVar437._12_4_ >> 0x18) +
            fVar450 * (float)auVar147._12_4_ + fVar452 * (float)(auVar149._12_4_ >> 0x18);
  fVar305 = fVar446 * fVar363 + fVar450 * (float)iVar192 + fVar452 * fVar233;
  fVar335 = fVar446 * fVar375 + fVar450 * fVar444 + fVar452 * fVar256;
  fVar337 = fVar446 * fVar379 + fVar450 * (float)auVar389._8_4_ + fVar452 * fVar258;
  fVar452 = fVar446 * (float)(auVar368._12_4_ >> 0x18) +
            fVar450 * (float)auVar393._12_4_ + fVar452 * (float)(auVar395._12_4_ >> 0x18);
  uVar135 = *(undefined8 *)(prim + uVar111 * 7 + 6);
  uVar9 = *(undefined8 *)(prim + uVar111 * 0xb + 6);
  uVar10 = *(undefined8 *)(prim + uVar111 * 9 + 6);
  uVar11 = *(undefined8 *)(prim + uVar111 * 0xd + 6);
  local_518._0_2_ = (short)uVar11;
  local_518._2_2_ = (undefined2)((ulong)uVar11 >> 0x10);
  fVar446 = (float)uVar11;
  uStack_514._0_2_ = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_514._2_2_ = (undefined2)((ulong)uVar11 >> 0x30);
  fVar450 = (float)((ulong)uVar11 >> 0x20);
  fStack_510 = 0.0;
  fStack_50c = 0.0;
  fVar341 = fVar340 * fVar284 + (float)iVar133 * fVar303 + (float)iVar190 * fVar304;
  fVar418 = fVar350 * fVar284 + fVar418 * fVar303 + fVar429 * fVar304;
  fVar429 = fVar353 * fVar284 + (float)auVar137._8_4_ * fVar303 + (float)auVar138._8_4_ * fVar304;
  fVar356 = (float)(auVar263._12_4_ >> 0x18) * fVar284 +
            (float)auVar324._12_4_ * fVar303 + (float)auVar143._12_4_ * fVar304;
  fVar447 = fVar261 * fVar284 + (float)iVar191 * fVar303 + fVar200 * fVar304;
  fVar451 = fVar282 * fVar284 + fVar362 * fVar303 + fVar226 * fVar304;
  fVar453 = fVar283 * fVar284 + (float)auVar139._8_4_ * fVar303 + fVar228 * fVar304;
  fVar454 = (float)(auVar437._12_4_ >> 0x18) * fVar284 +
            (float)auVar147._12_4_ * fVar303 + (float)(auVar149._12_4_ >> 0x18) * fVar304;
  fVar340 = fVar284 * fVar363 + fVar303 * (float)iVar192 + fVar304 * fVar233;
  fVar350 = fVar284 * fVar375 + fVar303 * fVar444 + fVar304 * fVar256;
  fVar353 = fVar284 * fVar379 + fVar303 * (float)auVar389._8_4_ + fVar304 * fVar258;
  fVar362 = fVar284 * (float)(auVar368._12_4_ >> 0x18) +
            fVar303 * (float)auVar393._12_4_ + fVar304 * (float)(auVar395._12_4_ >> 0x18);
  uVar124 = -(uint)(1e-18 <= ABS(fVar455));
  uVar126 = -(uint)(1e-18 <= ABS(fVar464));
  uVar128 = -(uint)(1e-18 <= ABS(fVar466));
  uVar130 = -(uint)(1e-18 <= ABS(fVar468));
  auVar457._0_4_ = (uint)fVar455 & uVar124;
  auVar457._4_4_ = (uint)fVar464 & uVar126;
  auVar457._8_4_ = (uint)fVar466 & uVar128;
  auVar457._12_4_ = (uint)fVar468 & uVar130;
  auVar151._0_8_ = CONCAT44(~uVar126,~uVar124) & 0x219392ef219392ef;
  auVar151._8_4_ = ~uVar128 & 0x219392ef;
  auVar151._12_4_ = ~uVar130 & 0x219392ef;
  auVar151 = auVar151 | auVar457;
  uVar124 = -(uint)(1e-18 <= ABS(fVar386));
  uVar126 = -(uint)(1e-18 <= ABS(fVar404));
  uVar128 = -(uint)(1e-18 <= ABS(fVar407));
  uVar130 = -(uint)(1e-18 <= ABS(fVar410));
  auVar397._0_4_ = (uint)fVar386 & uVar124;
  auVar397._4_4_ = (uint)fVar404 & uVar126;
  auVar397._8_4_ = (uint)fVar407 & uVar128;
  auVar397._12_4_ = (uint)fVar410 & uVar130;
  auVar235._0_8_ = CONCAT44(~uVar126,~uVar124) & 0x219392ef219392ef;
  auVar235._8_4_ = ~uVar128 & 0x219392ef;
  auVar235._12_4_ = ~uVar130 & 0x219392ef;
  auVar235 = auVar235 | auVar397;
  uVar124 = -(uint)(1e-18 <= ABS(fVar305));
  uVar126 = -(uint)(1e-18 <= ABS(fVar335));
  uVar128 = -(uint)(1e-18 <= ABS(fVar337));
  uVar130 = -(uint)(1e-18 <= ABS(fVar452));
  auVar309._0_4_ = (uint)fVar305 & uVar124;
  auVar309._4_4_ = (uint)fVar335 & uVar126;
  auVar309._8_4_ = (uint)fVar337 & uVar128;
  auVar309._12_4_ = (uint)fVar452 & uVar130;
  auVar287._0_8_ = CONCAT44(~uVar126,~uVar124) & 0x219392ef219392ef;
  auVar287._8_4_ = ~uVar128 & 0x219392ef;
  auVar287._12_4_ = ~uVar130 & 0x219392ef;
  auVar287 = auVar287 | auVar309;
  auVar310 = rcpps(auVar309,auVar151);
  fVar363 = auVar310._0_4_;
  auVar152._0_4_ = auVar151._0_4_ * fVar363;
  fVar375 = auVar310._4_4_;
  auVar152._4_4_ = auVar151._4_4_ * fVar375;
  fVar386 = auVar310._8_4_;
  auVar152._8_4_ = auVar151._8_4_ * fVar386;
  fVar404 = auVar310._12_4_;
  auVar152._12_4_ = auVar151._12_4_ * fVar404;
  fVar363 = (1.0 - auVar152._0_4_) * fVar363 + fVar363;
  fVar375 = (1.0 - auVar152._4_4_) * fVar375 + fVar375;
  fVar386 = (1.0 - auVar152._8_4_) * fVar386 + fVar386;
  fVar404 = (1.0 - auVar152._12_4_) * fVar404 + fVar404;
  auVar310 = rcpps(auVar152,auVar235);
  fVar200 = auVar310._0_4_;
  fVar228 = auVar310._4_4_;
  fVar282 = auVar310._8_4_;
  fVar305 = auVar310._12_4_;
  fVar200 = (1.0 - auVar235._0_4_ * fVar200) * fVar200 + fVar200;
  fVar228 = (1.0 - auVar235._4_4_ * fVar228) * fVar228 + fVar228;
  fVar282 = (1.0 - auVar235._8_4_ * fVar282) * fVar282 + fVar282;
  fVar305 = (1.0 - auVar235._12_4_ * fVar305) * fVar305 + fVar305;
  auVar310 = rcpps(auVar310,auVar287);
  fVar226 = auVar310._0_4_;
  auVar288._0_4_ = auVar287._0_4_ * fVar226;
  fVar233 = auVar310._4_4_;
  fVar256 = auVar287._4_4_ * fVar233;
  auVar285._0_8_ = CONCAT44(fVar256,auVar288._0_4_);
  fVar283 = auVar310._8_4_;
  auVar285._8_4_ = auVar287._8_4_ * fVar283;
  fVar335 = auVar310._12_4_;
  uVar119 = *(ulong *)(prim + uVar111 * 0x12 + 6);
  fVar226 = (1.0 - auVar288._0_4_) * fVar226 + fVar226;
  fVar233 = (1.0 - fVar256) * fVar233 + fVar233;
  fVar283 = (1.0 - auVar285._8_4_) * fVar283 + fVar283;
  fVar335 = (1.0 - auVar287._12_4_ * fVar335) * fVar335 + fVar335;
  uVar121 = *(ulong *)(prim + uVar111 * 0x16 + 6);
  dir.field_0._0_2_ = (undefined2)uVar135;
  dir.field_0._2_2_ = (undefined2)((ulong)uVar135 >> 0x10);
  dir.field_0._4_2_ = (undefined2)((ulong)uVar135 >> 0x20);
  dir.field_0._6_2_ = (undefined2)((ulong)uVar135 >> 0x30);
  auVar291._12_2_ = (short)((uint)fVar256 >> 0x10);
  auVar291._0_12_ = auVar285;
  auVar291._14_2_ = dir.field_0._6_2_;
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._0_10_ = auVar285._0_10_;
  auVar290._10_2_ = dir.field_0._4_2_;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._8_2_ = SUB42(fVar256,0);
  auVar289._0_8_ = auVar285._0_8_;
  auVar288._8_8_ = auVar289._8_8_;
  auVar288._6_2_ = dir.field_0._2_2_;
  auVar288._4_2_ = (short)((uint)auVar288._0_4_ >> 0x10);
  auVar292._0_4_ = (int)(short)dir.field_0._0_2_;
  iVar133 = auVar288._4_4_ >> 0x10;
  auVar286._0_8_ = CONCAT44(iVar133,auVar292._0_4_);
  auVar286._8_4_ = auVar289._8_4_ >> 0x10;
  auVar311._0_4_ = (float)auVar292._0_4_;
  fVar379 = (float)iVar133;
  auVar307._0_8_ = CONCAT44(fVar379,auVar311._0_4_);
  auVar307._8_4_ = (float)auVar286._8_4_;
  local_618._0_2_ = (undefined2)uVar9;
  local_618._2_2_ = (undefined2)((ulong)uVar9 >> 0x10);
  local_618._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_612 = (undefined2)((ulong)uVar9 >> 0x30);
  auVar295._12_2_ = (short)dir.field_0._2_2_ >> 0xf;
  auVar295._0_12_ = auVar286;
  auVar295._14_2_ = uStack_612;
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._0_10_ = auVar286._0_10_;
  auVar294._10_2_ = local_618._4_2_;
  auVar293._10_6_ = auVar294._10_6_;
  auVar293._8_2_ = dir.field_0._2_2_;
  auVar293._0_8_ = auVar286._0_8_;
  auVar292._8_8_ = auVar293._8_8_;
  auVar292._6_2_ = local_618._2_2_;
  auVar292._4_2_ = (short)dir.field_0._0_2_ >> 0xf;
  auVar314._12_2_ = (short)((uint)fVar379 >> 0x10);
  auVar314._0_12_ = auVar307;
  auVar314._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar313._12_4_ = auVar314._12_4_;
  auVar313._0_10_ = auVar307._0_10_;
  auVar313._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar312._10_6_ = auVar313._10_6_;
  auVar312._8_2_ = SUB42(fVar379,0);
  auVar312._0_8_ = auVar307._0_8_;
  auVar311._8_8_ = auVar312._8_8_;
  sVar132 = (short)((ulong)uVar10 >> 0x10);
  auVar311._6_2_ = sVar132;
  auVar311._4_2_ = (short)((uint)auVar311._0_4_ >> 0x10);
  auVar315._0_4_ = (int)(short)uVar10;
  iVar133 = auVar311._4_4_ >> 0x10;
  auVar308._0_8_ = CONCAT44(iVar133,auVar315._0_4_);
  auVar308._8_4_ = auVar312._8_4_ >> 0x10;
  fVar407 = (float)iVar133;
  auVar318._12_2_ = sVar132 >> 0xf;
  auVar318._0_12_ = auVar308;
  auVar318._14_2_ = uStack_514._2_2_;
  auVar317._12_4_ = auVar318._12_4_;
  auVar317._0_10_ = auVar308._0_10_;
  auVar317._10_2_ = (undefined2)uStack_514;
  auVar316._10_6_ = auVar317._10_6_;
  auVar316._8_2_ = sVar132;
  auVar316._0_8_ = auVar308._0_8_;
  auVar315._8_8_ = auVar316._8_8_;
  auVar315._6_2_ = local_518._2_2_;
  auVar315._4_2_ = (short)uVar10 >> 0xf;
  uVar189 = (undefined2)(uVar119 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar119;
  auVar238._12_2_ = uVar189;
  auVar238._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar119 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar119;
  auVar237._10_2_ = uVar189;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar189;
  auVar236._0_8_ = uVar119;
  uVar189 = (undefined2)(uVar119 >> 0x10);
  auVar99._4_8_ = auVar236._8_8_;
  auVar99._2_2_ = uVar189;
  auVar99._0_2_ = uVar189;
  fVar337 = (float)(auVar99._0_4_ >> 0x10);
  fVar452 = (float)(auVar236._8_4_ >> 0x10);
  uVar189 = (undefined2)(uVar121 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar121;
  auVar155._12_2_ = uVar189;
  auVar155._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar121 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar121;
  auVar154._10_2_ = uVar189;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar189;
  auVar153._0_8_ = uVar121;
  uVar189 = (undefined2)(uVar121 >> 0x10);
  auVar100._4_8_ = auVar153._8_8_;
  auVar100._2_2_ = uVar189;
  auVar100._0_2_ = uVar189;
  uVar117 = *(ulong *)(prim + uVar111 * 0x14 + 6);
  uVar189 = (undefined2)(uVar117 >> 0x30);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar117;
  auVar158._12_2_ = uVar189;
  auVar158._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar117 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar117;
  auVar157._10_2_ = uVar189;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar189;
  auVar156._0_8_ = uVar117;
  uVar189 = (undefined2)(uVar117 >> 0x10);
  auVar101._4_8_ = auVar156._8_8_;
  auVar101._2_2_ = uVar189;
  auVar101._0_2_ = uVar189;
  fVar256 = (float)(auVar101._0_4_ >> 0x10);
  fVar284 = (float)(auVar156._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar111 * 0x18 + 6);
  uVar189 = (undefined2)(uVar12 >> 0x30);
  auVar241._8_4_ = 0;
  auVar241._0_8_ = uVar12;
  auVar241._12_2_ = uVar189;
  auVar241._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar12 >> 0x20);
  auVar240._12_4_ = auVar241._12_4_;
  auVar240._8_2_ = 0;
  auVar240._0_8_ = uVar12;
  auVar240._10_2_ = uVar189;
  auVar239._10_6_ = auVar240._10_6_;
  auVar239._8_2_ = uVar189;
  auVar239._0_8_ = uVar12;
  uVar189 = (undefined2)(uVar12 >> 0x10);
  auVar102._4_8_ = auVar239._8_8_;
  auVar102._2_2_ = uVar189;
  auVar102._0_2_ = uVar189;
  uVar13 = *(ulong *)(prim + uVar111 * 0x1d + 6);
  uVar189 = (undefined2)(uVar13 >> 0x30);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar13;
  auVar161._12_2_ = uVar189;
  auVar161._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar13 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar13;
  auVar160._10_2_ = uVar189;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar189;
  auVar159._0_8_ = uVar13;
  uVar189 = (undefined2)(uVar13 >> 0x10);
  auVar103._4_8_ = auVar159._8_8_;
  auVar103._2_2_ = uVar189;
  auVar103._0_2_ = uVar189;
  fVar258 = (float)(auVar103._0_4_ >> 0x10);
  fVar303 = (float)(auVar159._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar111 * 0x21 + 6);
  uVar189 = (undefined2)(uVar14 >> 0x30);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar14;
  auVar244._12_2_ = uVar189;
  auVar244._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar14 >> 0x20);
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar14;
  auVar243._10_2_ = uVar189;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._8_2_ = uVar189;
  auVar242._0_8_ = uVar14;
  uVar189 = (undefined2)(uVar14 >> 0x10);
  auVar104._4_8_ = auVar242._8_8_;
  auVar104._2_2_ = uVar189;
  auVar104._0_2_ = uVar189;
  uVar15 = *(ulong *)(prim + uVar111 * 0x1f + 6);
  uVar189 = (undefined2)(uVar15 >> 0x30);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar15;
  auVar164._12_2_ = uVar189;
  auVar164._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar15 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar15;
  auVar163._10_2_ = uVar189;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar189;
  auVar162._0_8_ = uVar15;
  uVar189 = (undefined2)(uVar15 >> 0x10);
  auVar105._4_8_ = auVar162._8_8_;
  auVar105._2_2_ = uVar189;
  auVar105._0_2_ = uVar189;
  fVar261 = (float)(auVar105._0_4_ >> 0x10);
  fVar304 = (float)(auVar162._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar111 * 0x23 + 6);
  uVar189 = (undefined2)(uVar16 >> 0x30);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar16;
  auVar247._12_2_ = uVar189;
  auVar247._14_2_ = uVar189;
  uVar189 = (undefined2)(uVar16 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar16;
  auVar246._10_2_ = uVar189;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar189;
  auVar245._0_8_ = uVar16;
  uVar189 = (undefined2)(uVar16 >> 0x10);
  auVar106._4_8_ = auVar245._8_8_;
  auVar106._2_2_ = uVar189;
  auVar106._0_2_ = uVar189;
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar296._0_8_ =
       CONCAT44(((((float)(auVar292._4_4_ >> 0x10) - fVar379) * fVar232 + fVar379) - fVar418) *
                fVar375,((((float)(int)(short)local_618._0_2_ - auVar311._0_4_) * fVar232 +
                         auVar311._0_4_) - fVar341) * fVar363);
  auVar296._8_4_ =
       ((((float)(auVar293._8_4_ >> 0x10) - auVar307._8_4_) * fVar232 + auVar307._8_4_) - fVar429) *
       fVar386;
  auVar296._12_4_ =
       ((((float)(auVar294._12_4_ >> 0x10) - (float)(auVar290._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar290._12_4_ >> 0x10)) - fVar356) * fVar404;
  auVar319._0_4_ =
       ((((float)(int)(short)local_518 - (float)auVar315._0_4_) * fVar232 + (float)auVar315._0_4_) -
       fVar341) * fVar363;
  auVar319._4_4_ =
       ((((float)(auVar315._4_4_ >> 0x10) - fVar407) * fVar232 + fVar407) - fVar418) * fVar375;
  auVar319._8_4_ =
       ((((float)(auVar316._8_4_ >> 0x10) - (float)auVar308._8_4_) * fVar232 + (float)auVar308._8_4_
        ) - fVar429) * fVar386;
  auVar319._12_4_ =
       ((((float)(auVar317._12_4_ >> 0x10) - (float)(auVar313._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar313._12_4_ >> 0x10)) - fVar356) * fVar404;
  auVar344._0_8_ =
       CONCAT44(((((float)(auVar100._0_4_ >> 0x10) - fVar337) * fVar232 + fVar337) - fVar451) *
                fVar228,((((float)(int)(short)uVar121 - (float)(int)(short)uVar119) * fVar232 +
                         (float)(int)(short)uVar119) - fVar447) * fVar200);
  auVar344._8_4_ =
       ((((float)(auVar153._8_4_ >> 0x10) - fVar452) * fVar232 + fVar452) - fVar453) * fVar282;
  auVar344._12_4_ =
       ((((float)(auVar154._12_4_ >> 0x10) - (float)(auVar237._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar237._12_4_ >> 0x10)) - fVar454) * fVar305;
  auVar415._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar117) * fVar232 +
        (float)(int)(short)uVar117) - fVar447) * fVar200;
  auVar415._4_4_ =
       ((((float)(auVar102._0_4_ >> 0x10) - fVar256) * fVar232 + fVar256) - fVar451) * fVar228;
  auVar415._8_4_ =
       ((((float)(auVar239._8_4_ >> 0x10) - fVar284) * fVar232 + fVar284) - fVar453) * fVar282;
  auVar415._12_4_ =
       ((((float)(auVar240._12_4_ >> 0x10) - (float)(auVar157._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar157._12_4_ >> 0x10)) - fVar454) * fVar305;
  auVar427._0_8_ =
       CONCAT44(((((float)(auVar104._0_4_ >> 0x10) - fVar258) * fVar232 + fVar258) - fVar350) *
                fVar233,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar232 +
                         (float)(int)(short)uVar13) - fVar340) * fVar226);
  auVar427._8_4_ =
       ((((float)(auVar242._8_4_ >> 0x10) - fVar303) * fVar232 + fVar303) - fVar353) * fVar283;
  auVar427._12_4_ =
       ((((float)(auVar243._12_4_ >> 0x10) - (float)(auVar160._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar160._12_4_ >> 0x10)) - fVar362) * fVar335;
  auVar439._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar232 +
        (float)(int)(short)uVar15) - fVar340) * fVar226;
  auVar439._4_4_ =
       ((((float)(auVar106._0_4_ >> 0x10) - fVar261) * fVar232 + fVar261) - fVar350) * fVar233;
  auVar439._8_4_ =
       ((((float)(auVar245._8_4_ >> 0x10) - fVar304) * fVar232 + fVar304) - fVar353) * fVar283;
  auVar439._12_4_ =
       ((((float)(auVar246._12_4_ >> 0x10) - (float)(auVar163._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar163._12_4_ >> 0x10)) - fVar362) * fVar335;
  auVar248._8_4_ = auVar296._8_4_;
  auVar248._0_8_ = auVar296._0_8_;
  auVar248._12_4_ = auVar296._12_4_;
  auVar249 = minps(auVar248,auVar319);
  auVar201._8_4_ = auVar344._8_4_;
  auVar201._0_8_ = auVar344._0_8_;
  auVar201._12_4_ = auVar344._12_4_;
  auVar310 = minps(auVar201,auVar415);
  auVar249 = maxps(auVar249,auVar310);
  auVar202._8_4_ = auVar427._8_4_;
  auVar202._0_8_ = auVar427._0_8_;
  auVar202._12_4_ = auVar427._12_4_;
  auVar310 = minps(auVar202,auVar439);
  auVar165._4_4_ = uVar110;
  auVar165._0_4_ = uVar110;
  auVar165._8_4_ = uVar110;
  auVar165._12_4_ = uVar110;
  auVar310 = maxps(auVar310,auVar165);
  auVar310 = maxps(auVar249,auVar310);
  fVar200 = auVar310._0_4_ * 0.99999964;
  fVar226 = auVar310._4_4_ * 0.99999964;
  fVar228 = auVar310._8_4_ * 0.99999964;
  fVar233 = auVar310._12_4_ * 0.99999964;
  auVar310 = maxps(auVar296,auVar319);
  auVar249 = maxps(auVar344,auVar415);
  auVar310 = minps(auVar310,auVar249);
  auVar249 = maxps(auVar427,auVar439);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar203._4_4_ = uVar110;
  auVar203._0_4_ = uVar110;
  auVar203._8_4_ = uVar110;
  auVar203._12_4_ = uVar110;
  auVar249 = minps(auVar249,auVar203);
  auVar310 = minps(auVar310,auVar249);
  auVar204._0_4_ = -(uint)(PVar18 != (Primitive)0x0 && fVar200 <= auVar310._0_4_ * 1.0000004);
  auVar204._4_4_ = -(uint)(1 < (byte)PVar18 && fVar226 <= auVar310._4_4_ * 1.0000004);
  auVar204._8_4_ = -(uint)(2 < (byte)PVar18 && fVar228 <= auVar310._8_4_ * 1.0000004);
  auVar204._12_4_ = -(uint)(3 < (byte)PVar18 && fVar233 <= auVar310._12_4_ * 1.0000004);
  uVar124 = movmskps((int)(uVar111 * 0x18),auVar204);
  auVar205._0_12_ = mm_lookupmask_ps._240_12_;
  auVar205._12_4_ = 0;
LAB_003bf5da:
  if (uVar124 == 0) {
LAB_003c21ea:
    return uVar124 != 0;
  }
  lVar114 = 0;
  if (uVar124 != 0) {
    for (; (uVar124 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
    }
  }
  uVar126 = *(uint *)(prim + 2);
  uVar119 = (ulong)uVar126;
  uVar128 = *(uint *)(prim + lVar114 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar119].ptr;
  uVar121 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            (ulong)uVar128 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar256 = pGVar26->fnumTimeSegments;
  fVar258 = (pGVar26->time_range).lower;
  fVar258 = ((*(float *)(ray + k * 4 + 0x70) - fVar258) / ((pGVar26->time_range).upper - fVar258)) *
            fVar256;
  local_518 = fVar446;
  uStack_514 = fVar450;
  fVar446 = floorf(fVar258);
  fVar256 = fVar256 + -1.0;
  if (fVar256 <= fVar446) {
    fVar446 = fVar256;
  }
  fVar450 = 0.0;
  if (0.0 <= fVar446) {
    fVar450 = fVar446;
  }
  fVar258 = fVar258 - fVar450;
  fVar446 = 1.0 - fVar258;
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar120 = (long)(int)fVar450 * 0x38;
  lVar114 = *(long *)(_Var27 + lVar120);
  lVar28 = *(long *)(_Var27 + 0x10 + lVar120);
  pfVar1 = (float *)(lVar114 + lVar28 * uVar121);
  pfVar2 = (float *)(lVar114 + lVar28 * (uVar121 + 1));
  pfVar3 = (float *)(lVar114 + lVar28 * (uVar121 + 2));
  pfVar4 = (float *)(lVar114 + lVar28 * (uVar121 + 3));
  pSVar112 = *(StackEntry **)(_Var27 + 0x38 + lVar120);
  lVar114 = *(long *)(_Var27 + 0x48 + lVar120);
  uVar117 = (uVar121 + 1) * lVar114;
  pRVar115 = (RTCIntersectArguments *)(lVar114 * (uVar121 + 3));
  paVar5 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1 *)
           ((long)&(pSVar112->valid).field_0 + uVar121 * lVar114);
  paVar6 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1 *)
           ((long)&(pSVar112->valid).field_0 + uVar117);
  paVar7 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1 *)
           ((long)&(pSVar112->valid).field_0 + (uVar121 + 2) * lVar114);
  fVar232 = *pfVar1 * fVar446 + paVar5->v[0] * fVar258;
  fVar337 = pfVar1[1] * fVar446 + *(float *)((long)paVar5 + 4) * fVar258;
  fVar452 = pfVar1[2] * fVar446 + *(float *)((long)paVar5 + 8) * fVar258;
  fVar375 = *pfVar2 * fVar446 + paVar6->v[0] * fVar258;
  fVar379 = pfVar2[1] * fVar446 + *(float *)((long)paVar6 + 4) * fVar258;
  fVar386 = pfVar2[2] * fVar446 + *(float *)((long)paVar6 + 8) * fVar258;
  fVar256 = *(float *)(ray + k * 4 + 0x40);
  local_5c8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
  fVar282 = *(float *)(ray + k * 4 + 0x60);
  fVar450 = (float)local_5c8._4_4_ * (float)local_5c8._4_4_;
  fVar261 = fVar282 * fVar282;
  fVar304 = fVar450 + fVar256 * fVar256 + fVar261;
  auVar206._0_8_ = CONCAT44(fVar450 + fVar450 + 0.0,fVar304);
  auVar206._8_4_ = fVar450 + fVar261 + fVar261;
  auVar206._12_4_ = fVar450 + 0.0 + 0.0;
  auVar345._8_4_ = auVar206._8_4_;
  auVar345._0_8_ = auVar206._0_8_;
  auVar345._12_4_ = auVar206._12_4_;
  auVar310 = rcpss(auVar345,auVar206);
  fVar362 = (2.0 - auVar310._0_4_ * fVar304) * auVar310._0_4_ *
            (((fVar452 + fVar386) * 0.5 - *(float *)(ray + k * 4 + 0x20)) * fVar282 +
            ((fVar337 + fVar379) * 0.5 - *(float *)(ray + k * 4 + 0x10)) * (float)local_5c8._4_4_ +
            ((fVar232 + fVar375) * 0.5 - *(float *)(ray + k * 4)) * fVar256);
  local_618._0_4_ = fVar256 * fVar362 + *(float *)(ray + k * 4);
  fVar353 = (float)local_5c8._4_4_ * fVar362 + *(float *)(ray + k * 4 + 0x10);
  fStack_610 = fVar282 * fVar362 + *(float *)(ray + k * 4 + 0x20);
  fVar232 = fVar232 - (float)local_618._0_4_;
  fVar337 = fVar337 - fVar353;
  fVar452 = fVar452 - fStack_610;
  fVar363 = (pfVar1[3] * fVar446 + *(float *)((long)paVar5 + 0xc) * fVar258) - 0.0;
  fVar341 = (*pfVar3 * fVar446 + paVar7->v[0] * fVar258) - (float)local_618._0_4_;
  fVar418 = (pfVar3[1] * fVar446 + *(float *)((long)paVar7 + 4) * fVar258) - fVar353;
  fVar407 = (pfVar3[2] * fVar446 + *(float *)((long)paVar7 + 8) * fVar258) - fStack_610;
  fVar429 = (pfVar3[3] * fVar446 + *(float *)((long)paVar7 + 0xc) * fVar258) - 0.0;
  pfVar1 = (float *)((long)&pRVar115->flags + (long)pSVar112);
  fVar375 = fVar375 - (float)local_618._0_4_;
  fVar379 = fVar379 - fVar353;
  fVar386 = fVar386 - fStack_610;
  fVar404 = (pfVar2[3] * fVar446 + *(float *)((long)paVar6 + 0xc) * fVar258) - 0.0;
  local_618._0_4_ = (fVar258 * *pfVar1 + fVar446 * *pfVar4) - (float)local_618._0_4_;
  fVar353 = (fVar258 * pfVar1[1] + fVar446 * pfVar4[1]) - fVar353;
  fStack_610 = (fVar258 * pfVar1[2] + fVar446 * pfVar4[2]) - fStack_610;
  fStack_60c = (fVar258 * pfVar1[3] + fVar446 * pfVar4[3]) - 0.0;
  fVar446 = (float)local_5c8._4_4_ * (float)local_5c8._4_4_;
  fVar356 = fVar256 * fVar256;
  fVar410 = fVar356 + fVar446 + fVar261;
  fVar444 = fVar356 + fVar446 + fVar261;
  fVar447 = fVar356 + fVar446 + fVar261;
  fVar356 = fVar356 + fVar446 + fVar261;
  stack0xfffffffffffff9ec = fVar353;
  fVar258 = *(float *)(ray + k * 4 + 0x40);
  fVar305 = ABS(fVar410);
  fVar335 = ABS(fVar444);
  fVar340 = ABS(fVar447);
  fVar350 = ABS(fVar356);
  fVar261 = *(float *)(ray + k * 4 + 0x30);
  fVar303 = fVar261 - fVar362;
  uVar130 = 0;
  bVar122 = 0;
  uVar118 = 1;
  fVar283 = 0.0;
  fVar284 = 1.0;
  local_5c8._0_4_ = local_5c8._4_4_;
  fStack_5c0 = (float)local_5c8._4_4_;
  fStack_5bc = (float)local_5c8._4_4_;
  local_548 = fVar362;
  fStack_544 = fVar362;
  fStack_540 = fVar362;
  fStack_53c = fVar362;
  fStack_510 = fVar452;
  fStack_50c = fVar363;
  fVar446 = fVar232;
  fVar450 = fVar337;
  do {
    local_558._4_4_ = fVar284 - fVar283;
    local_558._0_4_ = local_558._4_4_;
    fStack_550 = (float)local_558._4_4_;
    fStack_54c = (float)local_558._4_4_;
    fVar466 = (float)local_558._4_4_ * 0.0 + fVar283;
    fVar227 = (float)local_558._4_4_ * 0.33333334 + fVar283;
    fVar229 = (float)local_558._4_4_ * 0.6666667 + fVar283;
    fVar230 = (float)local_558._4_4_ * 1.0 + fVar283;
    fVar364 = 1.0 - fVar466;
    fVar376 = 1.0 - fVar227;
    fVar380 = 1.0 - fVar229;
    fVar383 = 1.0 - fVar230;
    fVar234 = fVar466 * 3.0;
    fVar257 = fVar227 * 3.0;
    fVar259 = fVar229 * 3.0;
    fVar260 = fVar230 * 3.0;
    fVar387 = ((fVar364 * 3.0 + -5.0) * fVar364 * fVar364 + 2.0) * 0.5;
    fVar405 = ((fVar376 * 3.0 + -5.0) * fVar376 * fVar376 + 2.0) * 0.5;
    fVar408 = ((fVar380 * 3.0 + -5.0) * fVar380 * fVar380 + 2.0) * 0.5;
    fVar411 = ((fVar383 * 3.0 + -5.0) * fVar383 * fVar383 + 2.0) * 0.5;
    fVar306 = -fVar364 * fVar466 * fVar466 * 0.5;
    fVar336 = -fVar376 * fVar227 * fVar227 * 0.5;
    fVar338 = -fVar380 * fVar229 * fVar229 * 0.5;
    fVar339 = -fVar383 * fVar230 * fVar230 * 0.5;
    fVar413 = (fVar466 * fVar466 * (fVar234 + -5.0) + 2.0) * 0.5;
    fVar419 = (fVar227 * fVar227 * (fVar257 + -5.0) + 2.0) * 0.5;
    fVar421 = (fVar229 * fVar229 * (fVar259 + -5.0) + 2.0) * 0.5;
    fVar423 = (fVar230 * fVar230 * (fVar260 + -5.0) + 2.0) * 0.5;
    fVar451 = (float)local_558._4_4_ * 0.11111111;
    fVar470 = -fVar466 * fVar364 * fVar364 * 0.5;
    fVar475 = -fVar227 * fVar376 * fVar376 * 0.5;
    fVar478 = -fVar229 * fVar380 * fVar380 * 0.5;
    fVar480 = -fVar230 * fVar383 * fVar383 * 0.5;
    fVar453 = fVar232 * fVar470 +
              fVar375 * fVar413 + fVar341 * fVar387 + (float)local_618._0_4_ * fVar306;
    fVar455 = fVar232 * fVar475 +
              fVar375 * fVar419 + fVar341 * fVar405 + (float)local_618._0_4_ * fVar336;
    fVar468 = fVar232 * fVar478 +
              fVar375 * fVar421 + fVar341 * fVar408 + (float)local_618._0_4_ * fVar338;
    fVar197 = fVar232 * fVar480 +
              fVar375 * fVar423 + fVar341 * fVar411 + (float)local_618._0_4_ * fVar339;
    fVar454 = fVar337 * fVar470 + fVar379 * fVar413 + fVar418 * fVar387 + fVar353 * fVar306;
    fVar464 = fVar337 * fVar475 + fVar379 * fVar419 + fVar418 * fVar405 + fVar353 * fVar336;
    fVar195 = fVar337 * fVar478 + fVar379 * fVar421 + fVar418 * fVar408 + fVar353 * fVar338;
    fVar198 = fVar337 * fVar480 + fVar379 * fVar423 + fVar418 * fVar411 + fVar353 * fVar339;
    local_528 = fVar452 * fVar470 + fVar386 * fVar413 + fVar407 * fVar387 + fStack_610 * fVar306;
    fStack_524 = fVar452 * fVar475 + fVar386 * fVar419 + fVar407 * fVar405 + fStack_610 * fVar336;
    fStack_520 = fVar452 * fVar478 + fVar386 * fVar421 + fVar407 * fVar408 + fStack_610 * fVar338;
    fStack_51c = fVar452 * fVar480 + fVar386 * fVar423 + fVar407 * fVar411 + fStack_610 * fVar339;
    fVar471 = fVar470 * fVar363 + fVar413 * fVar404 + fVar387 * fVar429 + fVar306 * fStack_60c;
    fVar476 = fVar475 * fVar363 + fVar419 * fVar404 + fVar405 * fVar429 + fVar336 * fStack_60c;
    auVar473._0_8_ = CONCAT44(fVar476,fVar471);
    auVar473._8_4_ =
         fVar478 * fVar363 + fVar421 * fVar404 + fVar408 * fVar429 + fVar338 * fStack_60c;
    auVar473._12_4_ =
         fVar480 * fVar363 + fVar423 * fVar404 + fVar411 * fVar429 + fVar339 * fStack_60c;
    fVar387 = fVar466 * (fVar364 + fVar364);
    fVar408 = fVar227 * (fVar376 + fVar376);
    fVar413 = fVar229 * (fVar380 + fVar380);
    fVar421 = fVar230 * (fVar383 + fVar383);
    fVar405 = (fVar387 - fVar364 * fVar364) * 0.5;
    fVar411 = (fVar408 - fVar376 * fVar376) * 0.5;
    fVar419 = (fVar413 - fVar380 * fVar380) * 0.5;
    fVar470 = (fVar421 - fVar383 * fVar383) * 0.5;
    fVar336 = (fVar466 * fVar234 + (fVar466 + fVar466) * (fVar234 + -5.0)) * 0.5;
    fVar306 = (fVar227 * fVar257 + (fVar227 + fVar227) * (fVar257 + -5.0)) * 0.5;
    fVar338 = (fVar229 * fVar259 + (fVar229 + fVar229) * (fVar259 + -5.0)) * 0.5;
    fVar339 = (fVar230 * fVar260 + (fVar230 + fVar230) * (fVar260 + -5.0)) * 0.5;
    fVar234 = ((fVar234 + 2.0) * (fVar364 + fVar364) - fVar364 * 3.0 * fVar364) * 0.5;
    fVar257 = ((fVar257 + 2.0) * (fVar376 + fVar376) - fVar376 * 3.0 * fVar376) * 0.5;
    fVar259 = ((fVar259 + 2.0) * (fVar380 + fVar380) - fVar380 * 3.0 * fVar380) * 0.5;
    fVar260 = ((fVar260 + 2.0) * (fVar383 + fVar383) - fVar383 * 3.0 * fVar383) * 0.5;
    fVar364 = (fVar466 * fVar466 - fVar387) * 0.5;
    fVar466 = (fVar227 * fVar227 - fVar408) * 0.5;
    fVar227 = (fVar229 * fVar229 - fVar413) * 0.5;
    fVar229 = (fVar230 * fVar230 - fVar421) * 0.5;
    fVar423 = (fVar232 * fVar405 +
              fVar375 * fVar336 + fVar341 * fVar234 + (float)local_618._0_4_ * fVar364) * fVar451;
    fVar475 = (fVar232 * fVar411 +
              fVar375 * fVar306 + fVar341 * fVar257 + (float)local_618._0_4_ * fVar466) * fVar451;
    fVar478 = (fVar232 * fVar419 +
              fVar375 * fVar338 + fVar341 * fVar259 + (float)local_618._0_4_ * fVar227) * fVar451;
    fVar480 = (fVar232 * fVar470 +
              fVar375 * fVar339 + fVar341 * fVar260 + (float)local_618._0_4_ * fVar229) * fVar451;
    fVar414 = (fVar337 * fVar405 + fVar379 * fVar336 + fVar418 * fVar234 + fVar353 * fVar364) *
              fVar451;
    fVar420 = (fVar337 * fVar411 + fVar379 * fVar306 + fVar418 * fVar257 + fVar353 * fVar466) *
              fVar451;
    fVar422 = (fVar337 * fVar419 + fVar379 * fVar338 + fVar418 * fVar259 + fVar353 * fVar227) *
              fVar451;
    fVar424 = (fVar337 * fVar470 + fVar379 * fVar339 + fVar418 * fVar260 + fVar353 * fVar229) *
              fVar451;
    fVar425 = (fVar452 * fVar405 + fVar386 * fVar336 + fVar407 * fVar234 + fStack_610 * fVar364) *
              fVar451;
    fVar430 = (fVar452 * fVar411 + fVar386 * fVar306 + fVar407 * fVar257 + fStack_610 * fVar466) *
              fVar451;
    fVar432 = (fVar452 * fVar419 + fVar386 * fVar338 + fVar407 * fVar259 + fStack_610 * fVar227) *
              fVar451;
    fVar434 = (fVar452 * fVar470 + fVar386 * fVar339 + fVar407 * fVar260 + fStack_610 * fVar229) *
              fVar451;
    fVar466 = fVar451 * (fVar411 * fVar363 +
                        fVar306 * fVar404 + fVar257 * fVar429 + fVar466 * fStack_60c);
    fVar227 = fVar451 * (fVar419 * fVar363 +
                        fVar338 * fVar404 + fVar259 * fVar429 + fVar227 * fStack_60c);
    fVar306 = fVar451 * (fVar470 * fVar363 +
                        fVar339 * fVar404 + fVar260 * fVar429 + fVar229 * fStack_60c);
    auVar359._4_4_ = auVar473._8_4_;
    auVar359._0_4_ = fVar476;
    auVar359._8_4_ = auVar473._12_4_;
    auVar359._12_4_ = 0;
    local_6b8._4_4_ = fVar476 + fVar466;
    local_6b8._0_4_ =
         fVar471 + fVar451 * (fVar405 * fVar363 +
                             fVar336 * fVar404 + fVar234 * fVar429 + fVar364 * fStack_60c);
    fStack_6b0 = auVar473._8_4_ + fVar227;
    fStack_6ac = auVar473._12_4_ + fVar306;
    auVar360._0_8_ = CONCAT44(auVar473._8_4_ - fVar227,fVar476 - fVar466);
    auVar360._8_4_ = auVar473._12_4_ - fVar306;
    auVar360._12_4_ = 0;
    fVar456 = fVar464 - fVar454;
    fVar465 = fVar195 - fVar464;
    fVar467 = fVar198 - fVar195;
    fVar469 = 0.0 - fVar198;
    local_538 = fStack_524 - local_528;
    fStack_534 = fStack_520 - fStack_524;
    fStack_530 = fStack_51c - fStack_520;
    fStack_52c = 0.0 - fStack_51c;
    fVar451 = fVar414 * local_538 - fVar425 * fVar456;
    fVar466 = fVar420 * fStack_534 - fVar430 * fVar465;
    fVar227 = fVar422 * fStack_530 - fVar432 * fVar467;
    fVar306 = fVar424 * fStack_52c - fVar434 * fVar469;
    fVar342 = fVar455 - fVar453;
    fVar351 = fVar468 - fVar455;
    fVar354 = fVar197 - fVar468;
    fVar357 = 0.0 - fVar197;
    fVar339 = fVar425 * fVar342 - fVar423 * local_538;
    fVar257 = fVar430 * fVar351 - fVar475 * fStack_534;
    fVar260 = fVar432 * fVar354 - fVar478 * fStack_530;
    fVar387 = fVar434 * fVar357 - fVar480 * fStack_52c;
    fVar376 = fVar423 * fVar456 - fVar414 * fVar342;
    fVar408 = fVar475 * fVar465 - fVar420 * fVar351;
    fVar411 = fVar478 * fVar467 - fVar422 * fVar354;
    fVar380 = fVar480 * fVar469 - fVar424 * fVar357;
    auVar207._0_4_ = local_538 * local_538;
    auVar207._4_4_ = fStack_534 * fStack_534;
    auVar207._8_4_ = fStack_530 * fStack_530;
    auVar207._12_4_ = fStack_52c * fStack_52c;
    auVar297._0_4_ = fVar342 * fVar342 + fVar456 * fVar456 + auVar207._0_4_;
    auVar297._4_4_ = fVar351 * fVar351 + fVar465 * fVar465 + auVar207._4_4_;
    auVar297._8_4_ = fVar354 * fVar354 + fVar467 * fVar467 + auVar207._8_4_;
    auVar297._12_4_ = fVar357 * fVar357 + fVar469 * fVar469 + auVar207._12_4_;
    auVar310 = rcpps(auVar207,auVar297);
    fVar336 = auVar310._0_4_;
    fVar229 = auVar310._4_4_;
    fVar338 = auVar310._8_4_;
    fVar230 = auVar310._12_4_;
    fVar336 = (1.0 - fVar336 * auVar297._0_4_) * fVar336 + fVar336;
    fVar229 = (1.0 - fVar229 * auVar297._4_4_) * fVar229 + fVar229;
    fVar338 = (1.0 - fVar338 * auVar297._8_4_) * fVar338 + fVar338;
    fVar230 = (1.0 - fVar230 * auVar297._12_4_) * fVar230 + fVar230;
    fVar234 = local_538 * fVar420 - fVar456 * fVar430;
    fVar259 = fStack_534 * fVar422 - fVar465 * fVar432;
    fVar364 = fStack_530 * fVar424 - fVar467 * fVar434;
    fVar405 = fStack_52c * 0.0 - fVar469 * 0.0;
    fVar413 = fVar342 * fVar430 - local_538 * fVar475;
    fVar419 = fVar351 * fVar432 - fStack_534 * fVar478;
    fVar383 = fVar354 * fVar434 - fStack_530 * fVar480;
    fVar421 = fVar357 * 0.0 - fStack_52c * 0.0;
    fVar470 = fVar456 * fVar475 - fVar342 * fVar420;
    fVar471 = fVar465 * fVar478 - fVar351 * fVar422;
    fVar476 = fVar467 * fVar480 - fVar354 * fVar424;
    fVar445 = fVar469 * 0.0 - fVar357 * 0.0;
    auVar166._0_4_ = (fVar451 * fVar451 + fVar339 * fVar339 + fVar376 * fVar376) * fVar336;
    auVar166._4_4_ = (fVar466 * fVar466 + fVar257 * fVar257 + fVar408 * fVar408) * fVar229;
    auVar166._8_4_ = (fVar227 * fVar227 + fVar260 * fVar260 + fVar411 * fVar411) * fVar338;
    auVar166._12_4_ = (fVar306 * fVar306 + fVar387 * fVar387 + fVar380 * fVar380) * fVar230;
    auVar265._0_4_ = (fVar234 * fVar234 + fVar413 * fVar413 + fVar470 * fVar470) * fVar336;
    auVar265._4_4_ = (fVar259 * fVar259 + fVar419 * fVar419 + fVar471 * fVar471) * fVar229;
    auVar265._8_4_ = (fVar364 * fVar364 + fVar383 * fVar383 + fVar476 * fVar476) * fVar338;
    auVar265._12_4_ = (fVar405 * fVar405 + fVar421 * fVar421 + fVar445 * fVar445) * fVar230;
    auVar310 = maxps(auVar166,auVar265);
    auVar398._8_4_ = auVar473._8_4_;
    auVar398._0_8_ = auVar473._0_8_;
    auVar398._12_4_ = auVar473._12_4_;
    auVar399 = maxps(auVar398,_local_6b8);
    auVar266._8_4_ = auVar360._8_4_;
    auVar266._0_8_ = auVar360._0_8_;
    auVar266._12_4_ = 0;
    auVar249 = maxps(auVar266,auVar359);
    auVar399 = maxps(auVar399,auVar249);
    auVar474 = minps(auVar473,_local_6b8);
    auVar249 = minps(auVar360,auVar359);
    auVar474 = minps(auVar474,auVar249);
    auVar310 = sqrtps(auVar310,auVar310);
    auVar249 = rsqrtps(auVar310,auVar297);
    fVar451 = auVar249._0_4_;
    fVar466 = auVar249._4_4_;
    fVar227 = auVar249._8_4_;
    fVar306 = auVar249._12_4_;
    fVar413 = fVar451 * 1.5 - fVar451 * fVar451 * auVar297._0_4_ * 0.5 * fVar451;
    fVar419 = fVar466 * 1.5 - fVar466 * fVar466 * auVar297._4_4_ * 0.5 * fVar466;
    fVar383 = fVar227 * 1.5 - fVar227 * fVar227 * auVar297._8_4_ * 0.5 * fVar227;
    fVar421 = fVar306 * 1.5 - fVar306 * fVar306 * auVar297._12_4_ * 0.5 * fVar306;
    fVar339 = 0.0 - fVar454;
    fVar259 = 0.0 - fVar464;
    fVar387 = 0.0 - fVar195;
    fVar408 = 0.0 - fVar198;
    fVar470 = 0.0 - local_528;
    fVar471 = 0.0 - fStack_524;
    fVar476 = 0.0 - fStack_520;
    fVar445 = 0.0 - fStack_51c;
    fVar451 = 0.0 - fVar453;
    fVar227 = 0.0 - fVar455;
    fVar336 = 0.0 - fVar468;
    fVar338 = 0.0 - fVar197;
    auVar458._0_4_ =
         fVar258 * fVar342 * fVar413 +
         (float)local_5c8._4_4_ * fVar456 * fVar413 + fVar282 * local_538 * fVar413;
    auVar458._4_4_ =
         fVar258 * fVar351 * fVar419 +
         (float)local_5c8._4_4_ * fVar465 * fVar419 + fVar282 * fStack_534 * fVar419;
    auVar458._8_4_ =
         fVar258 * fVar354 * fVar383 +
         (float)local_5c8._4_4_ * fVar467 * fVar383 + fVar282 * fStack_530 * fVar383;
    auVar458._12_4_ =
         fVar258 * fVar357 * fVar421 +
         (float)local_5c8._4_4_ * fVar469 * fVar421 + fVar282 * fStack_52c * fVar421;
    fVar343 = fVar342 * fVar413 * fVar451 +
              fVar456 * fVar413 * fVar339 + local_538 * fVar413 * fVar470;
    fVar352 = fVar351 * fVar419 * fVar227 +
              fVar465 * fVar419 * fVar259 + fStack_534 * fVar419 * fVar471;
    fVar355 = fVar354 * fVar383 * fVar336 +
              fVar467 * fVar383 * fVar387 + fStack_530 * fVar383 * fVar476;
    fVar358 = fVar357 * fVar421 * fVar338 +
              fVar469 * fVar421 * fVar408 + fStack_52c * fVar421 * fVar445;
    fVar426 = (fVar258 * fVar451 + (float)local_5c8._4_4_ * fVar339 + fVar282 * fVar470) -
              auVar458._0_4_ * fVar343;
    fVar431 = (fVar258 * fVar227 + (float)local_5c8._4_4_ * fVar259 + fVar282 * fVar471) -
              auVar458._4_4_ * fVar352;
    fVar433 = (fVar258 * fVar336 + (float)local_5c8._4_4_ * fVar387 + fVar282 * fVar476) -
              auVar458._8_4_ * fVar355;
    fVar435 = (fVar258 * fVar338 + (float)local_5c8._4_4_ * fVar408 + fVar282 * fVar445) -
              auVar458._12_4_ * fVar358;
    fVar257 = (fVar451 * fVar451 + fVar339 * fVar339 + fVar470 * fVar470) - fVar343 * fVar343;
    fVar364 = (fVar227 * fVar227 + fVar259 * fVar259 + fVar471 * fVar471) - fVar352 * fVar352;
    fVar376 = (fVar336 * fVar336 + fVar387 * fVar387 + fVar476 * fVar476) - fVar355 * fVar355;
    fVar380 = (fVar338 * fVar338 + fVar408 * fVar408 + fVar445 * fVar445) - fVar358 * fVar358;
    fVar466 = (auVar399._0_4_ + auVar310._0_4_) * 1.0000002;
    fVar306 = (auVar399._4_4_ + auVar310._4_4_) * 1.0000002;
    fVar229 = (auVar399._8_4_ + auVar310._8_4_) * 1.0000002;
    fVar230 = (auVar399._12_4_ + auVar310._12_4_) * 1.0000002;
    fVar466 = fVar257 - fVar466 * fVar466;
    fVar306 = fVar364 - fVar306 * fVar306;
    fVar229 = fVar376 - fVar229 * fVar229;
    fVar230 = fVar380 - fVar230 * fVar230;
    fVar472 = fVar410 - auVar458._0_4_ * auVar458._0_4_;
    fVar477 = fVar444 - auVar458._4_4_ * auVar458._4_4_;
    fVar479 = fVar447 - auVar458._8_4_ * auVar458._8_4_;
    fVar481 = fVar356 - auVar458._12_4_ * auVar458._12_4_;
    fVar426 = fVar426 + fVar426;
    fVar431 = fVar431 + fVar431;
    fVar433 = fVar433 + fVar433;
    fVar435 = fVar435 + fVar435;
    auVar416._0_4_ = fVar426 * fVar426 - fVar472 * 4.0 * fVar466;
    auVar416._4_4_ = fVar431 * fVar431 - fVar477 * 4.0 * fVar306;
    auVar416._8_4_ = fVar433 * fVar433 - fVar479 * 4.0 * fVar229;
    auVar416._12_4_ = fVar435 * fVar435 - fVar481 * 4.0 * fVar230;
    local_418._4_4_ = (auVar474._4_4_ - auVar310._4_4_) * 0.99999976;
    local_418._0_4_ = (auVar474._0_4_ - auVar310._0_4_) * 0.99999976;
    fStack_410 = (auVar474._8_4_ - auVar310._8_4_) * 0.99999976;
    fStack_40c = (auVar474._12_4_ - auVar310._12_4_) * 0.99999976;
    auVar298._4_4_ = -(uint)(0.0 <= auVar416._4_4_);
    auVar298._0_4_ = -(uint)(0.0 <= auVar416._0_4_);
    auVar298._8_4_ = -(uint)(0.0 <= auVar416._8_4_);
    auVar298._12_4_ = -(uint)(0.0 <= auVar416._12_4_);
    iVar133 = movmskps((int)pSVar112,auVar298);
    auVar400._0_8_ = CONCAT44(fVar431,fVar426) ^ 0x8000000080000000;
    auVar400._8_4_ = -fVar433;
    auVar400._12_4_ = -fVar435;
    auVar267._0_8_ =
         CONCAT44(auVar458._4_4_ * auVar458._4_4_,auVar458._0_4_ * auVar458._0_4_) &
         0x7fffffff7fffffff;
    auVar267._8_4_ = ABS(auVar458._8_4_ * auVar458._8_4_);
    auVar267._12_4_ = ABS(auVar458._12_4_ * auVar458._12_4_);
    fVar234 = ABS(fVar472);
    fVar260 = ABS(fVar477);
    fVar405 = ABS(fVar479);
    fVar411 = ABS(fVar481);
    if (iVar133 == 0) {
      iVar133 = 0;
      auVar169 = _DAT_01f45a40;
      auVar370 = _DAT_01f45a30;
      auVar401 = auVar400;
      auVar459 = auVar458;
    }
    else {
      auVar249 = sqrtps(_local_5c8,auVar416);
      bVar123 = 0.0 <= auVar416._0_4_;
      uVar125 = -(uint)bVar123;
      bVar30 = 0.0 <= auVar416._4_4_;
      uVar127 = -(uint)bVar30;
      bVar31 = 0.0 <= auVar416._8_4_;
      uVar129 = -(uint)bVar31;
      bVar32 = 0.0 <= auVar416._12_4_;
      uVar131 = -(uint)bVar32;
      auVar167._0_4_ = fVar472 + fVar472;
      auVar167._4_4_ = fVar477 + fVar477;
      auVar167._8_4_ = fVar479 + fVar479;
      auVar167._12_4_ = fVar481 + fVar481;
      auVar320._8_4_ = auVar267._8_4_;
      auVar320._0_8_ = auVar267._0_8_;
      auVar320._12_4_ = auVar267._12_4_;
      auVar310 = rcpps(auVar267,auVar167);
      fVar365 = auVar310._0_4_;
      fVar377 = auVar310._4_4_;
      fVar381 = auVar310._8_4_;
      fVar384 = auVar310._12_4_;
      fVar365 = (1.0 - auVar167._0_4_ * fVar365) * fVar365 + fVar365;
      fVar377 = (1.0 - auVar167._4_4_ * fVar377) * fVar377 + fVar377;
      fVar381 = (1.0 - auVar167._8_4_ * fVar381) * fVar381 + fVar381;
      fVar384 = (1.0 - auVar167._12_4_ * fVar384) * fVar384 + fVar384;
      fVar134 = (-fVar426 - auVar249._0_4_) * fVar365;
      fVar193 = (-fVar431 - auVar249._4_4_) * fVar377;
      fVar196 = (auVar400._8_4_ - auVar249._8_4_) * fVar381;
      fVar199 = (auVar400._12_4_ - auVar249._12_4_) * fVar384;
      fVar365 = (auVar249._0_4_ - fVar426) * fVar365;
      fVar377 = (auVar249._4_4_ - fVar431) * fVar377;
      fVar381 = (auVar249._8_4_ - fVar433) * fVar381;
      fVar384 = (auVar249._12_4_ - fVar435) * fVar384;
      auVar401._0_4_ = (auVar458._0_4_ * fVar134 + fVar343) * fVar413;
      auVar401._4_4_ = (auVar458._4_4_ * fVar193 + fVar352) * fVar419;
      auVar401._8_4_ = (auVar458._8_4_ * fVar196 + fVar355) * fVar383;
      auVar401._12_4_ = (auVar458._12_4_ * fVar199 + fVar358) * fVar421;
      auVar459._0_4_ = (auVar458._0_4_ * fVar365 + fVar343) * fVar413;
      auVar459._4_4_ = (auVar458._4_4_ * fVar377 + fVar352) * fVar419;
      auVar459._8_4_ = (auVar458._8_4_ * fVar381 + fVar355) * fVar383;
      auVar459._12_4_ = (auVar458._12_4_ * fVar384 + fVar358) * fVar421;
      auVar168._0_4_ = (uint)fVar134 & uVar125;
      auVar168._4_4_ = (uint)fVar193 & uVar127;
      auVar168._8_4_ = (uint)fVar196 & uVar129;
      auVar168._12_4_ = (uint)fVar199 & uVar131;
      auVar370._0_8_ = CONCAT44(~uVar127,~uVar125) & 0x7f8000007f800000;
      auVar370._8_4_ = ~uVar129 & 0x7f800000;
      auVar370._12_4_ = ~uVar131 & 0x7f800000;
      auVar370 = auVar370 | auVar168;
      auVar440._0_4_ = (uint)fVar365 & uVar125;
      auVar440._4_4_ = (uint)fVar377 & uVar127;
      auVar440._8_4_ = (uint)fVar381 & uVar129;
      auVar440._12_4_ = (uint)fVar384 & uVar131;
      auVar169._0_8_ = CONCAT44(~uVar127,~uVar125) & 0xff800000ff800000;
      auVar169._8_4_ = ~uVar129 & 0xff800000;
      auVar169._12_4_ = ~uVar131 & 0xff800000;
      auVar169 = auVar169 | auVar440;
      auVar80._4_4_ = fVar335;
      auVar80._0_4_ = fVar305;
      auVar80._8_4_ = fVar340;
      auVar80._12_4_ = fVar350;
      auVar310 = maxps(auVar80,auVar320);
      fVar134 = auVar310._0_4_ * 1.9073486e-06;
      fVar193 = auVar310._4_4_ * 1.9073486e-06;
      fVar196 = auVar310._8_4_ * 1.9073486e-06;
      fVar199 = auVar310._12_4_ * 1.9073486e-06;
      auVar441._0_4_ = -(uint)(fVar234 < fVar134 && bVar123);
      auVar441._4_4_ = -(uint)(fVar260 < fVar193 && bVar30);
      auVar441._8_4_ = -(uint)(fVar405 < fVar196 && bVar31);
      auVar441._12_4_ = -(uint)(fVar411 < fVar199 && bVar32);
      iVar133 = movmskps(iVar133,auVar441);
      if (iVar133 != 0) {
        uVar125 = -(uint)(fVar466 <= 0.0);
        uVar127 = -(uint)(fVar306 <= 0.0);
        uVar129 = -(uint)(fVar229 <= 0.0);
        uVar131 = -(uint)(fVar230 <= 0.0);
        auVar278._0_4_ = (uVar125 & 0xff800000 | ~uVar125 & 0x7f800000) & auVar441._0_4_;
        auVar278._4_4_ = (uVar127 & 0xff800000 | ~uVar127 & 0x7f800000) & auVar441._4_4_;
        auVar278._8_4_ = (uVar129 & 0xff800000 | ~uVar129 & 0x7f800000) & auVar441._8_4_;
        auVar278._12_4_ = (uVar131 & 0xff800000 | ~uVar131 & 0x7f800000) & auVar441._12_4_;
        auVar333._0_4_ = ~auVar441._0_4_ & auVar370._0_4_;
        auVar333._4_4_ = ~auVar441._4_4_ & auVar370._4_4_;
        auVar333._8_4_ = ~auVar441._8_4_ & auVar370._8_4_;
        auVar333._12_4_ = ~auVar441._12_4_ & auVar370._12_4_;
        auVar370 = auVar333 | auVar278;
        auVar302._0_4_ = (uVar125 & 0x7f800000 | ~uVar125 & 0xff800000) & auVar441._0_4_;
        auVar302._4_4_ = (uVar127 & 0x7f800000 | ~uVar127 & 0xff800000) & auVar441._4_4_;
        auVar302._8_4_ = (uVar129 & 0x7f800000 | ~uVar129 & 0xff800000) & auVar441._8_4_;
        auVar302._12_4_ = (uVar131 & 0x7f800000 | ~uVar131 & 0xff800000) & auVar441._12_4_;
        auVar443._0_4_ = ~auVar441._0_4_ & auVar169._0_4_;
        auVar443._4_4_ = ~auVar441._4_4_ & auVar169._4_4_;
        auVar443._8_4_ = ~auVar441._8_4_ & auVar169._8_4_;
        auVar443._12_4_ = ~auVar441._12_4_ & auVar169._12_4_;
        auVar169 = auVar443 | auVar302;
        auVar298._4_4_ = -(uint)((fVar193 <= fVar260 || fVar306 <= 0.0) && bVar30);
        auVar298._0_4_ = -(uint)((fVar134 <= fVar234 || fVar466 <= 0.0) && bVar123);
        auVar298._8_4_ = -(uint)((fVar196 <= fVar405 || fVar229 <= 0.0) && bVar31);
        auVar298._12_4_ = -(uint)((fVar199 <= fVar411 || fVar230 <= 0.0) && bVar32);
      }
    }
    auVar299._0_4_ = (auVar298._0_4_ << 0x1f) >> 0x1f;
    auVar299._4_4_ = (auVar298._4_4_ << 0x1f) >> 0x1f;
    auVar299._8_4_ = (auVar298._8_4_ << 0x1f) >> 0x1f;
    auVar299._12_4_ = (auVar298._12_4_ << 0x1f) >> 0x1f;
    auVar299 = auVar299 & auVar205;
    iVar133 = movmskps(iVar133,auVar299);
    pRVar116 = pRVar115;
    fVar466 = local_548;
    fVar306 = fStack_544;
    fVar229 = fStack_540;
    fVar230 = fStack_53c;
    if (iVar133 != 0) {
      fVar134 = *(float *)(ray + k * 4 + 0x80);
      auVar321._0_4_ = fVar134 - fVar362;
      auVar321._4_4_ = auVar321._0_4_;
      auVar321._8_4_ = auVar321._0_4_;
      auVar321._12_4_ = auVar321._0_4_;
      auVar249 = minps(auVar321,auVar169);
      auVar82._4_4_ = fVar303;
      auVar82._0_4_ = fVar303;
      auVar82._8_4_ = fVar303;
      auVar82._12_4_ = fVar303;
      auVar399 = maxps(auVar82,auVar370);
      auVar170._0_4_ = fVar414 * (float)local_5c8._4_4_ + fVar425 * fVar282;
      auVar170._4_4_ = fVar420 * (float)local_5c8._4_4_ + fVar430 * fVar282;
      auVar170._8_4_ = fVar422 * (float)local_5c8._4_4_ + fVar432 * fVar282;
      auVar170._12_4_ = fVar424 * (float)local_5c8._4_4_ + fVar434 * fVar282;
      auVar448._0_4_ = fVar423 * fVar258 + auVar170._0_4_;
      auVar448._4_4_ = fVar475 * fVar258 + auVar170._4_4_;
      auVar448._8_4_ = fVar478 * fVar258 + auVar170._8_4_;
      auVar448._12_4_ = fVar480 * fVar258 + auVar170._12_4_;
      auVar310 = rcpps(auVar170,auVar448);
      fVar193 = auVar310._0_4_;
      fVar196 = auVar310._4_4_;
      fVar199 = auVar310._8_4_;
      fVar365 = auVar310._12_4_;
      fVar451 = ((1.0 - auVar448._0_4_ * fVar193) * fVar193 + fVar193) *
                -(fVar451 * fVar423 + fVar339 * fVar414 + fVar470 * fVar425);
      fVar227 = ((1.0 - auVar448._4_4_ * fVar196) * fVar196 + fVar196) *
                -(fVar227 * fVar475 + fVar259 * fVar420 + fVar471 * fVar430);
      fVar336 = ((1.0 - auVar448._8_4_ * fVar199) * fVar199 + fVar199) *
                -(fVar336 * fVar478 + fVar387 * fVar422 + fVar476 * fVar432);
      fVar338 = ((1.0 - auVar448._12_4_ * fVar365) * fVar365 + fVar365) *
                -(fVar338 * fVar480 + fVar408 * fVar424 + fVar445 * fVar434);
      uVar125 = -(uint)(auVar448._0_4_ < 0.0 || ABS(auVar448._0_4_) < 1e-18);
      uVar127 = -(uint)(auVar448._4_4_ < 0.0 || ABS(auVar448._4_4_) < 1e-18);
      uVar129 = -(uint)(auVar448._8_4_ < 0.0 || ABS(auVar448._8_4_) < 1e-18);
      uVar131 = -(uint)(auVar448._12_4_ < 0.0 || ABS(auVar448._12_4_) < 1e-18);
      auVar346._0_8_ = CONCAT44(uVar127,uVar125) & 0xff800000ff800000;
      auVar346._8_4_ = uVar129 & 0xff800000;
      auVar346._12_4_ = uVar131 & 0xff800000;
      auVar171._0_4_ = ~uVar125 & (uint)fVar451;
      auVar171._4_4_ = ~uVar127 & (uint)fVar227;
      auVar171._8_4_ = ~uVar129 & (uint)fVar336;
      auVar171._12_4_ = ~uVar131 & (uint)fVar338;
      auVar399 = maxps(auVar399,auVar171 | auVar346);
      uVar125 = -(uint)(0.0 < auVar448._0_4_ || ABS(auVar448._0_4_) < 1e-18);
      uVar127 = -(uint)(0.0 < auVar448._4_4_ || ABS(auVar448._4_4_) < 1e-18);
      uVar129 = -(uint)(0.0 < auVar448._8_4_ || ABS(auVar448._8_4_) < 1e-18);
      uVar131 = -(uint)(0.0 < auVar448._12_4_ || ABS(auVar448._12_4_) < 1e-18);
      auVar172._0_8_ = CONCAT44(uVar127,uVar125) & 0x7f8000007f800000;
      auVar172._8_4_ = uVar129 & 0x7f800000;
      auVar172._12_4_ = uVar131 & 0x7f800000;
      auVar449._0_4_ = ~uVar125 & (uint)fVar451;
      auVar449._4_4_ = ~uVar127 & (uint)fVar227;
      auVar449._8_4_ = ~uVar129 & (uint)fVar336;
      auVar449._12_4_ = ~uVar131 & (uint)fVar338;
      auVar249 = minps(auVar249,auVar449 | auVar172);
      auVar250._0_4_ = (0.0 - fVar464) * -fVar420 + (0.0 - fStack_524) * -fVar430;
      auVar250._4_4_ = (0.0 - fVar195) * -fVar422 + (0.0 - fStack_520) * -fVar432;
      auVar250._8_4_ = (0.0 - fVar198) * -fVar424 + (0.0 - fStack_51c) * -fVar434;
      auVar250._12_4_ = 0x80000000;
      auVar208._0_4_ = -fVar475 * fVar258 + -fVar420 * (float)local_5c8._4_4_ + -fVar430 * fVar282;
      auVar208._4_4_ = -fVar478 * fVar258 + -fVar422 * (float)local_5c8._4_4_ + -fVar432 * fVar282;
      auVar208._8_4_ = -fVar480 * fVar258 + -fVar424 * (float)local_5c8._4_4_ + -fVar434 * fVar282;
      auVar208._12_4_ = fVar258 * -0.0 + (float)local_5c8._4_4_ * -0.0 + fVar282 * -0.0;
      auVar310 = rcpps(auVar250,auVar208);
      fVar451 = auVar310._0_4_;
      fVar227 = auVar310._4_4_;
      fVar336 = auVar310._8_4_;
      fVar338 = auVar310._12_4_;
      fVar451 = (((float)DAT_01f46a60 - auVar208._0_4_ * fVar451) * fVar451 + fVar451) *
                -((0.0 - fVar455) * -fVar475 + auVar250._0_4_);
      fVar227 = ((DAT_01f46a60._4_4_ - auVar208._4_4_ * fVar227) * fVar227 + fVar227) *
                -((0.0 - fVar468) * -fVar478 + auVar250._4_4_);
      fVar336 = ((DAT_01f46a60._8_4_ - auVar208._8_4_ * fVar336) * fVar336 + fVar336) *
                -((0.0 - fVar197) * -fVar480 + auVar250._8_4_);
      fVar338 = ((DAT_01f46a60._12_4_ - auVar208._12_4_ * fVar338) * fVar338 + fVar338) * 0.0;
      uVar125 = -(uint)(auVar208._0_4_ < 0.0 || ABS(auVar208._0_4_) < 1e-18);
      uVar127 = -(uint)(auVar208._4_4_ < 0.0 || ABS(auVar208._4_4_) < 1e-18);
      uVar129 = -(uint)(auVar208._8_4_ < 0.0 || ABS(auVar208._8_4_) < 1e-18);
      uVar131 = -(uint)(auVar208._12_4_ < 0.0 || ABS(auVar208._12_4_) < 1e-18);
      auVar371._0_8_ = CONCAT44(uVar127,uVar125) & 0xff800000ff800000;
      auVar371._8_4_ = uVar129 & 0xff800000;
      auVar371._12_4_ = uVar131 & 0xff800000;
      auVar173._0_4_ = ~uVar125 & (uint)fVar451;
      auVar173._4_4_ = ~uVar127 & (uint)fVar227;
      auVar173._8_4_ = ~uVar129 & (uint)fVar336;
      auVar173._12_4_ = ~uVar131 & (uint)fVar338;
      auVar310 = maxps(auVar399,auVar173 | auVar371);
      uVar125 = -(uint)(0.0 < auVar208._0_4_ || ABS(auVar208._0_4_) < 1e-18);
      uVar127 = -(uint)(0.0 < auVar208._4_4_ || ABS(auVar208._4_4_) < 1e-18);
      uVar129 = -(uint)(0.0 < auVar208._8_4_ || ABS(auVar208._8_4_) < 1e-18);
      uVar131 = -(uint)(0.0 < auVar208._12_4_ || ABS(auVar208._12_4_) < 1e-18);
      auVar174._0_8_ = CONCAT44(uVar127,uVar125) & 0x7f8000007f800000;
      auVar174._8_4_ = uVar129 & 0x7f800000;
      auVar174._12_4_ = uVar131 & 0x7f800000;
      auVar209._0_4_ = ~uVar125 & (uint)fVar451;
      auVar209._4_4_ = ~uVar127 & (uint)fVar227;
      auVar209._8_4_ = ~uVar129 & (uint)fVar336;
      auVar209._12_4_ = ~uVar131 & (uint)fVar338;
      aVar322 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar249,auVar209 | auVar174);
      fVar338 = auVar310._12_4_;
      fVar451 = auVar310._0_4_;
      fVar227 = auVar310._4_4_;
      fVar336 = auVar310._8_4_;
      auVar210._0_4_ = -(uint)(fVar451 <= aVar322.v[0]) & auVar299._0_4_;
      auVar210._4_4_ = -(uint)(fVar227 <= aVar322.v[1]) & auVar299._4_4_;
      auVar210._8_4_ = -(uint)(fVar336 <= aVar322.v[2]) & auVar299._8_4_;
      auVar210._12_4_ = -(uint)(fVar338 <= aVar322.v[3]) & auVar299._12_4_;
      iVar133 = movmskps(iVar133,auVar210);
      if (iVar133 != 0) {
        auVar249 = maxps(ZEXT816(0),_local_418);
        auVar175._0_4_ = auVar249._0_4_ * auVar249._0_4_;
        auVar175._4_4_ = auVar249._4_4_ * auVar249._4_4_;
        auVar175._8_4_ = auVar249._8_4_ * auVar249._8_4_;
        auVar175._12_4_ = auVar249._12_4_ * auVar249._12_4_;
        auVar249 = minps(auVar401,_DAT_01f46a60);
        _local_5a8 = ZEXT812(0);
        fStack_59c = 0.0;
        auVar249 = maxps(auVar249,_local_5a8);
        auVar399 = minps(auVar459,_DAT_01f46a60);
        auVar399 = maxps(auVar399,_local_5a8);
        auVar73._4_4_ = fVar283;
        auVar73._0_4_ = fVar283;
        auVar73._8_4_ = fVar283;
        auVar73._12_4_ = fVar283;
        local_108[0] = (auVar249._0_4_ + 0.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        local_108[1] = (auVar249._4_4_ + 1.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        local_108[2] = (auVar249._8_4_ + 2.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        local_108[3] = (auVar249._12_4_ + 3.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        local_118[0] = (auVar399._0_4_ + 0.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        local_118[1] = (auVar399._4_4_ + 1.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        local_118[2] = (auVar399._8_4_ + 2.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        local_118[3] = (auVar399._12_4_ + 3.0) * 0.25 * (float)local_558._4_4_ + fVar283;
        fVar257 = fVar257 - auVar175._0_4_;
        fVar364 = fVar364 - auVar175._4_4_;
        fVar376 = fVar376 - auVar175._8_4_;
        fVar380 = fVar380 - auVar175._12_4_;
        auVar372._0_4_ = fVar426 * fVar426 - fVar472 * 4.0 * fVar257;
        auVar372._4_4_ = fVar431 * fVar431 - fVar477 * 4.0 * fVar364;
        auVar372._8_4_ = fVar433 * fVar433 - fVar479 * 4.0 * fVar376;
        auVar372._12_4_ = fVar435 * fVar435 - fVar481 * 4.0 * fVar380;
        local_638._4_4_ = -(uint)(0.0 <= auVar372._4_4_);
        local_638._0_4_ = -(uint)(0.0 <= auVar372._0_4_);
        uStack_630 = -(uint)(0.0 <= auVar372._8_4_);
        uStack_62c = -(uint)(0.0 <= auVar372._12_4_);
        iVar133 = movmskps(iVar133,_local_638);
        if (iVar133 == 0) {
          _local_5f8 = ZEXT816(0);
          fVar453 = 0.0;
          fVar454 = 0.0;
          fVar455 = 0.0;
          fVar464 = 0.0;
          fVar468 = 0.0;
          fVar195 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          _local_598 = ZEXT816(0);
          _local_558 = ZEXT816(0);
          iVar133 = 0;
          auVar176 = _DAT_01f45a40;
          auVar442 = _DAT_01f45a30;
        }
        else {
          auVar399 = sqrtps(auVar73,auVar372);
          auVar251._0_4_ = fVar472 + fVar472;
          auVar251._4_4_ = fVar477 + fVar477;
          auVar251._8_4_ = fVar479 + fVar479;
          auVar251._12_4_ = fVar481 + fVar481;
          auVar249 = rcpps(auVar175,auVar251);
          fVar339 = auVar249._0_4_;
          fVar387 = auVar249._4_4_;
          fVar423 = auVar249._8_4_;
          fVar475 = auVar249._12_4_;
          fVar339 = ((float)DAT_01f46a60 - auVar251._0_4_ * fVar339) * fVar339 + fVar339;
          fVar387 = (DAT_01f46a60._4_4_ - auVar251._4_4_ * fVar387) * fVar387 + fVar387;
          fVar423 = (DAT_01f46a60._8_4_ - auVar251._8_4_ * fVar423) * fVar423 + fVar423;
          fVar475 = (DAT_01f46a60._12_4_ - auVar251._12_4_ * fVar475) * fVar475 + fVar475;
          local_1d8 = (float)auVar400._0_8_;
          fStack_1d4 = (float)(auVar400._0_8_ >> 0x20);
          fVar478 = (local_1d8 - auVar399._0_4_) * fVar339;
          fVar476 = (fStack_1d4 - auVar399._4_4_) * fVar387;
          fVar480 = (auVar400._8_4_ - auVar399._8_4_) * fVar423;
          fVar445 = (auVar400._12_4_ - auVar399._12_4_) * fVar475;
          fVar339 = (auVar399._0_4_ - fVar426) * fVar339;
          fVar387 = (auVar399._4_4_ - fVar431) * fVar387;
          fVar423 = (auVar399._8_4_ - fVar433) * fVar423;
          fVar475 = (auVar399._12_4_ - fVar435) * fVar475;
          fVar259 = (auVar458._0_4_ * fVar478 + fVar343) * fVar413;
          fVar408 = (auVar458._4_4_ * fVar476 + fVar352) * fVar419;
          fVar470 = (auVar458._8_4_ * fVar480 + fVar355) * fVar383;
          fVar471 = (auVar458._12_4_ * fVar445 + fVar358) * fVar421;
          local_5a8._4_4_ = fVar258 * fVar476 - (fVar351 * fVar408 + fVar455);
          local_5a8._0_4_ = fVar258 * fVar478 - (fVar342 * fVar259 + fVar453);
          fStack_5a0 = fVar258 * fVar480 - (fVar354 * fVar470 + fVar468);
          fStack_59c = fVar258 * fVar445 - (fVar357 * fVar471 + fVar197);
          local_598._4_4_ = (float)local_5c8._4_4_ * fVar476 - (fVar465 * fVar408 + fVar464);
          local_598._0_4_ = (float)local_5c8._4_4_ * fVar478 - (fVar456 * fVar259 + fVar454);
          fStack_590 = (float)local_5c8._4_4_ * fVar480 - (fVar467 * fVar470 + fVar195);
          fStack_58c = (float)local_5c8._4_4_ * fVar445 - (fVar469 * fVar471 + fVar198);
          local_558._4_4_ = fVar282 * fVar476 - (fVar408 * fStack_534 + fStack_524);
          local_558._0_4_ = fVar282 * fVar478 - (fVar259 * local_538 + local_528);
          fStack_550 = fVar282 * fVar480 - (fVar470 * fStack_530 + fStack_520);
          fStack_54c = fVar282 * fVar445 - (fVar471 * fStack_52c + fStack_51c);
          fVar413 = (auVar458._0_4_ * fVar339 + fVar343) * fVar413;
          fVar419 = (auVar458._4_4_ * fVar387 + fVar352) * fVar419;
          fVar383 = (auVar458._8_4_ * fVar423 + fVar355) * fVar383;
          fVar421 = (auVar458._12_4_ * fVar475 + fVar358) * fVar421;
          local_5f8._4_4_ = fVar258 * fVar387 - (fVar351 * fVar419 + fVar455);
          local_5f8._0_4_ = fVar258 * fVar339 - (fVar342 * fVar413 + fVar453);
          fStack_5f0 = fVar258 * fVar423 - (fVar354 * fVar383 + fVar468);
          fStack_5ec = fVar258 * fVar475 - (fVar357 * fVar421 + fVar197);
          fVar453 = (float)local_5c8._4_4_ * fVar339 - (fVar456 * fVar413 + fVar454);
          fVar454 = (float)local_5c8._4_4_ * fVar387 - (fVar465 * fVar419 + fVar464);
          fVar455 = (float)local_5c8._4_4_ * fVar423 - (fVar467 * fVar383 + fVar195);
          fVar464 = (float)local_5c8._4_4_ * fVar475 - (fVar469 * fVar421 + fVar198);
          bVar123 = 0.0 <= auVar372._0_4_;
          uVar125 = -(uint)bVar123;
          bVar30 = 0.0 <= auVar372._4_4_;
          uVar127 = -(uint)bVar30;
          bVar31 = 0.0 <= auVar372._8_4_;
          uVar129 = -(uint)bVar31;
          bVar32 = 0.0 <= auVar372._12_4_;
          uVar131 = -(uint)bVar32;
          fVar468 = fVar282 * fVar339 - (fVar413 * local_538 + local_528);
          fVar195 = fVar282 * fVar387 - (fVar419 * fStack_534 + fStack_524);
          fVar197 = fVar282 * fVar423 - (fVar383 * fStack_530 + fStack_520);
          fVar198 = fVar282 * fVar475 - (fVar421 * fStack_52c + fStack_51c);
          auVar252._0_4_ = (uint)fVar478 & uVar125;
          auVar252._4_4_ = (uint)fVar476 & uVar127;
          auVar252._8_4_ = (uint)fVar480 & uVar129;
          auVar252._12_4_ = (uint)fVar445 & uVar131;
          auVar442._0_8_ = CONCAT44(~uVar127,~uVar125) & 0x7f8000007f800000;
          auVar442._8_4_ = ~uVar129 & 0x7f800000;
          auVar442._12_4_ = ~uVar131 & 0x7f800000;
          auVar442 = auVar442 | auVar252;
          auVar347._0_4_ = (uint)fVar339 & uVar125;
          auVar347._4_4_ = (uint)fVar387 & uVar127;
          auVar347._8_4_ = (uint)fVar423 & uVar129;
          auVar347._12_4_ = (uint)fVar475 & uVar131;
          auVar176._0_8_ = CONCAT44(~uVar127,~uVar125) & 0xff800000ff800000;
          auVar176._8_4_ = ~uVar129 & 0xff800000;
          auVar176._12_4_ = ~uVar131 & 0xff800000;
          auVar176 = auVar176 | auVar347;
          auVar81._4_4_ = fVar335;
          auVar81._0_4_ = fVar305;
          auVar81._8_4_ = fVar340;
          auVar81._12_4_ = fVar350;
          auVar249 = maxps(auVar81,auVar267);
          fVar339 = auVar249._0_4_ * 1.9073486e-06;
          fVar259 = auVar249._4_4_ * 1.9073486e-06;
          fVar387 = auVar249._8_4_ * 1.9073486e-06;
          fVar408 = auVar249._12_4_ * 1.9073486e-06;
          auVar348._0_4_ = -(uint)(fVar234 < fVar339 && bVar123);
          auVar348._4_4_ = -(uint)(fVar260 < fVar259 && bVar30);
          auVar348._8_4_ = -(uint)(fVar405 < fVar387 && bVar31);
          auVar348._12_4_ = -(uint)(fVar411 < fVar408 && bVar32);
          iVar133 = movmskps(iVar133,auVar348);
          if (iVar133 != 0) {
            uVar125 = -(uint)(fVar257 <= 0.0);
            uVar127 = -(uint)(fVar364 <= 0.0);
            uVar129 = -(uint)(fVar376 <= 0.0);
            uVar131 = -(uint)(fVar380 <= 0.0);
            auVar402._0_4_ = (uVar125 & 0xff800000 | ~uVar125 & 0x7f800000) & auVar348._0_4_;
            auVar402._4_4_ = (uVar127 & 0xff800000 | ~uVar127 & 0x7f800000) & auVar348._4_4_;
            auVar402._8_4_ = (uVar129 & 0xff800000 | ~uVar129 & 0x7f800000) & auVar348._8_4_;
            auVar402._12_4_ = (uVar131 & 0xff800000 | ~uVar131 & 0x7f800000) & auVar348._12_4_;
            auVar428._0_4_ = ~auVar348._0_4_ & auVar442._0_4_;
            auVar428._4_4_ = ~auVar348._4_4_ & auVar442._4_4_;
            auVar428._8_4_ = ~auVar348._8_4_ & auVar442._8_4_;
            auVar428._12_4_ = ~auVar348._12_4_ & auVar442._12_4_;
            auVar442 = auVar428 | auVar402;
            auVar374._0_4_ = (uVar125 & 0x7f800000 | ~uVar125 & 0xff800000) & auVar348._0_4_;
            auVar374._4_4_ = (uVar127 & 0x7f800000 | ~uVar127 & 0xff800000) & auVar348._4_4_;
            auVar374._8_4_ = (uVar129 & 0x7f800000 | ~uVar129 & 0xff800000) & auVar348._8_4_;
            auVar374._12_4_ = (uVar131 & 0x7f800000 | ~uVar131 & 0xff800000) & auVar348._12_4_;
            auVar349._0_4_ = ~auVar348._0_4_ & auVar176._0_4_;
            auVar349._4_4_ = ~auVar348._4_4_ & auVar176._4_4_;
            auVar349._8_4_ = ~auVar348._8_4_ & auVar176._8_4_;
            auVar349._12_4_ = ~auVar348._12_4_ & auVar176._12_4_;
            auVar176 = auVar349 | auVar374;
            local_638._4_4_ = -(uint)((fVar259 <= fVar260 || fVar364 <= 0.0) && bVar30);
            local_638._0_4_ = -(uint)((fVar339 <= fVar234 || fVar257 <= 0.0) && bVar123);
            uStack_630 = -(uint)((fVar387 <= fVar405 || fVar376 <= 0.0) && bVar31);
            uStack_62c = -(uint)((fVar408 <= fVar411 || fVar380 <= 0.0) && bVar32);
          }
        }
        uVar388 = (uint)DAT_01f46710;
        uVar406 = DAT_01f46710._4_4_;
        uVar409 = DAT_01f46710._8_4_;
        uVar412 = DAT_01f46710._12_4_;
        auVar249 = minps((undefined1  [16])aVar322,auVar442);
        aVar373 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar310,auVar176);
        tp1.lower.field_0 = aVar373;
        tp1.upper.field_0 = aVar322;
        uVar125 = -(uint)(fVar451 <= auVar249._0_4_) & auVar210._0_4_;
        uVar127 = -(uint)(fVar227 <= auVar249._4_4_) & auVar210._4_4_;
        uVar135 = CONCAT44(uVar127,uVar125);
        uVar129 = -(uint)(fVar336 <= auVar249._8_4_) & auVar210._8_4_;
        uVar131 = -(uint)(fVar338 <= auVar249._12_4_) & auVar210._12_4_;
        uVar366 = -(uint)(aVar373.v[0] <= aVar322.v[0]) & auVar210._0_4_;
        uVar378 = -(uint)(aVar373.v[1] <= aVar322.v[1]) & auVar210._4_4_;
        auVar177._4_4_ = uVar378;
        auVar177._0_4_ = uVar366;
        uVar382 = -(uint)(aVar373.v[2] <= aVar322.v[2]) & auVar210._8_4_;
        uVar385 = -(uint)(aVar373.v[3] <= aVar322.v[3]) & auVar210._12_4_;
        auVar211._8_4_ = uVar129;
        auVar211._0_8_ = uVar135;
        auVar211._12_4_ = uVar131;
        auVar177._8_4_ = uVar382;
        auVar177._12_4_ = uVar385;
        iVar133 = movmskps(iVar133,auVar177 | auVar211);
        lVar114 = CONCAT44((int)((ulong)pSVar112 >> 0x20),iVar133);
        if (iVar133 != 0) {
          auVar323._8_4_ = uVar129;
          auVar323._0_8_ = uVar135;
          auVar323._12_4_ = uVar131;
          local_558._0_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_558._0_4_ * fVar282 +
                                                            (float)local_598._0_4_ *
                                                            (float)local_5c8._4_4_ +
                                                           local_5a8._0_4_ * fVar258) & uVar388)) &
                             local_638._0_4_) << 0x1f) >> 0x1f) + 4);
          local_558._4_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_558._4_4_ * fVar282 +
                                                            (float)local_598._4_4_ *
                                                            (float)local_5c8._4_4_ +
                                                           local_5a8._4_4_ * fVar258) & uVar406)) &
                             local_638._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_550 = (float)-(uint)((int)uVar118 <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_550 * fVar282 +
                                                                           fStack_590 *
                                                                           (float)local_5c8._4_4_ +
                                                                          local_5a8._8_4_ * fVar258)
                                                                   & uVar409)) & uStack_630) << 0x1f
                                           ) >> 0x1f) + 4);
          fStack_54c = (float)-(uint)((int)uVar118 <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_54c * fVar282 +
                                                                           fStack_58c *
                                                                           (float)local_5c8._4_4_ +
                                                                          local_5a8._12_4_ * fVar258
                                                                          ) & uVar412)) & uStack_62c
                                            ) << 0x1f) >> 0x1f) + 4);
          auVar178 = ~_local_558 & auVar323;
          local_538 = local_548 + fVar451;
          fStack_534 = fStack_544 + fVar227;
          fStack_530 = fStack_540 + fVar336;
          fStack_52c = fStack_53c + fVar338;
          auVar249 = _DAT_01f46710;
          while( true ) {
            vVar107.field_0 = tp1.lower.field_0;
            uStack_514._2_2_ = (undefined2)((uint)fVar450 >> 0x10);
            uStack_514._0_2_ = SUB42(fVar450,0);
            local_2e8 = auVar178;
            uVar110 = (undefined4)((ulong)lVar114 >> 0x20);
            iVar133 = movmskps((int)lVar114,auVar178);
            lVar114 = CONCAT44(uVar110,iVar133);
            if (iVar133 == 0) break;
            auVar474 = ~auVar178 & _DAT_01f45a30 | auVar178 & auVar310;
            auVar268._4_4_ = auVar474._0_4_;
            auVar268._0_4_ = auVar474._4_4_;
            auVar268._8_4_ = auVar474._12_4_;
            auVar268._12_4_ = auVar474._8_4_;
            auVar399 = minps(auVar268,auVar474);
            auVar212._0_8_ = auVar399._8_8_;
            auVar212._8_4_ = auVar399._0_4_;
            auVar212._12_4_ = auVar399._4_4_;
            auVar399 = minps(auVar212,auVar399);
            auVar213._0_8_ =
                 CONCAT44(-(uint)(auVar399._4_4_ == auVar474._4_4_) & auVar178._4_4_,
                          -(uint)(auVar399._0_4_ == auVar474._0_4_) & auVar178._0_4_);
            auVar213._8_4_ = -(uint)(auVar399._8_4_ == auVar474._8_4_) & auVar178._8_4_;
            auVar213._12_4_ = -(uint)(auVar399._12_4_ == auVar474._12_4_) & auVar178._12_4_;
            iVar133 = movmskps(iVar133,auVar213);
            if (iVar133 != 0) {
              auVar178._8_4_ = auVar213._8_4_;
              auVar178._0_8_ = auVar213._0_8_;
              auVar178._12_4_ = auVar213._12_4_;
            }
            uVar108 = movmskps(iVar133,auVar178);
            uVar121 = CONCAT44(uVar110,uVar108);
            lVar114 = 0;
            if (uVar121 != 0) {
              for (; (uVar121 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
              }
            }
            *(undefined4 *)(local_2e8 + lVar114 * 4) = 0;
            auVar74._4_2_ = (undefined2)uStack_514;
            auVar74._0_4_ = fVar446;
            auVar74._6_2_ = uStack_514._2_2_;
            auVar74._8_4_ = fStack_510;
            auVar74._12_4_ = fStack_50c;
            auVar78._4_4_ = fVar379;
            auVar78._0_4_ = fVar375;
            auVar78._8_4_ = fVar386;
            auVar78._12_4_ = fVar404;
            auVar474 = minps(auVar74,auVar78);
            auVar324 = maxps(auVar74,auVar78);
            auVar76._4_4_ = fVar418;
            auVar76._0_4_ = fVar341;
            auVar76._8_4_ = fVar407;
            auVar76._12_4_ = fVar429;
            auVar399 = minps(auVar76,_local_618);
            auVar474 = minps(auVar474,auVar399);
            auVar399 = maxps(auVar76,_local_618);
            auVar324 = maxps(auVar324,auVar399);
            auVar269._0_4_ = auVar474._0_4_ & auVar249._0_4_;
            auVar269._4_4_ = auVar474._4_4_ & auVar249._4_4_;
            auVar269._8_4_ = auVar474._8_4_ & auVar249._8_4_;
            auVar269._12_4_ = auVar474._12_4_ & auVar249._12_4_;
            auVar179._0_4_ = auVar324._0_4_ & auVar249._0_4_;
            auVar179._4_4_ = auVar324._4_4_ & auVar249._4_4_;
            auVar179._8_4_ = auVar324._8_4_ & auVar249._8_4_;
            auVar179._12_4_ = (uint)auVar324._12_4_ & auVar249._12_4_;
            auVar399 = maxps(auVar269,auVar179);
            fVar466 = auVar399._4_4_;
            if (auVar399._4_4_ <= auVar399._0_4_) {
              fVar466 = auVar399._0_4_;
            }
            auVar270._8_8_ = auVar399._8_8_;
            auVar270._0_8_ = auVar399._8_8_;
            if (auVar399._8_4_ <= fVar466) {
              auVar270._0_4_ = fVar466;
            }
            fVar466 = auVar270._0_4_ * 1.9073486e-06;
            auVar325._4_4_ = local_108[lVar114];
            auVar325._0_4_ = local_118[lVar114 + -8];
            auVar325._8_8_ = 0;
            for (uVar121 = 0; uVar121 != 5; uVar121 = uVar121 + 1) {
              fVar376 = auVar325._0_4_;
              fVar408 = auVar325._4_4_;
              fVar229 = SQRT(fVar304) * 1.9073486e-06 * fVar376;
              fVar339 = 1.0 - fVar408;
              fVar234 = fVar408 * 3.0;
              fVar306 = -fVar408 * fVar339 * fVar339 * 0.5;
              fVar411 = (fVar408 * fVar408 * (fVar234 + -5.0) + 2.0) * 0.5;
              fVar405 = ((fVar339 * 3.0 + -5.0) * fVar339 * fVar339 + 2.0) * 0.5;
              fVar380 = -fVar339 * fVar408 * fVar408 * 0.5;
              fVar230 = fVar306 * fStack_50c +
                        fVar411 * fVar404 + fVar405 * fVar429 + fVar380 * fStack_60c;
              fVar260 = (fVar408 * (fVar339 + fVar339) - fVar339 * fVar339) * 0.5;
              fVar259 = ((fVar408 + fVar408) * (fVar234 + -5.0) + fVar408 * fVar234) * 0.5;
              fVar257 = ((fVar234 + 2.0) * (fVar339 + fVar339) + fVar339 * -3.0 * fVar339) * 0.5;
              fVar339 = (fVar339 * -2.0 * fVar408 + fVar408 * fVar408) * 0.5;
              fVar413 = fVar260 * fVar446 +
                        fVar259 * fVar375 + fVar257 * fVar341 + fVar339 * (float)local_618._0_4_;
              fVar419 = fVar260 * fVar450 +
                        fVar259 * fVar379 + fVar257 * fVar418 + fVar339 * fVar353;
              fVar383 = fVar260 * fStack_510 +
                        fVar259 * fVar386 + fVar257 * fVar407 + fVar339 * fStack_610;
              fVar421 = fVar260 * fStack_50c +
                        fVar259 * fVar404 + fVar257 * fVar429 + fVar339 * fStack_60c;
              fVar257 = fVar408 * -3.0 + 2.0;
              fVar364 = fVar408 * 9.0 + -5.0;
              fVar339 = fVar408 * -9.0 + 4.0;
              fVar234 = fVar234 + -1.0;
              fVar259 = fVar257 * fVar446 +
                        fVar364 * fVar375 + fVar339 * fVar341 + fVar234 * (float)local_618._0_4_;
              fVar260 = fVar257 * fVar450 +
                        fVar364 * fVar379 + fVar339 * fVar418 + fVar234 * fVar353;
              fVar387 = fVar257 * fStack_510 +
                        fVar364 * fVar386 + fVar339 * fVar407 + fVar234 * fStack_610;
              fVar257 = (fVar376 * fVar256 + 0.0) -
                        (fVar306 * fVar446 +
                        fVar411 * fVar375 + fVar405 * fVar341 + fVar380 * (float)local_618._0_4_);
              fVar364 = (fVar376 * (float)local_5c8._4_4_ + 0.0) -
                        (fVar306 * fVar450 +
                        fVar411 * fVar379 + fVar405 * fVar418 + fVar380 * fVar353);
              fVar405 = (fVar376 * fVar282 + 0.0) -
                        (fVar306 * fStack_510 +
                        fVar411 * fVar386 + fVar405 * fVar407 + fVar380 * fStack_610);
              fVar411 = (fVar376 * 0.0 + 0.0) - fVar230;
              fVar306 = fVar364 * fVar364;
              fVar339 = fVar405 * fVar405;
              fVar234 = fVar411 * fVar411;
              auVar417._0_4_ = fVar306 + fVar257 * fVar257 + fVar339;
              auVar417._4_4_ = fVar306 + fVar306 + fVar234;
              auVar417._8_4_ = fVar306 + fVar339 + fVar339;
              auVar417._12_4_ = fVar306 + fVar234 + fVar234;
              fVar306 = fVar466;
              if (fVar466 <= fVar229) {
                fVar306 = fVar229;
              }
              fVar339 = fVar419 * fVar419 + fVar413 * fVar413 + fVar383 * fVar383;
              auVar399 = ZEXT416((uint)fVar339);
              auVar249 = rsqrtss(ZEXT416((uint)fVar339),auVar399);
              fVar229 = auVar249._0_4_;
              fVar234 = fVar229 * 1.5 - fVar229 * fVar229 * fVar339 * 0.5 * fVar229;
              fVar476 = fVar413 * fVar234;
              fVar480 = fVar419 * fVar234;
              fVar445 = fVar383 * fVar234;
              fVar342 = fVar421 * fVar234;
              fVar475 = fVar387 * fVar383 + fVar260 * fVar419 + fVar259 * fVar413;
              auVar249 = rcpss(auVar399,auVar399);
              fVar229 = (2.0 - fVar339 * auVar249._0_4_) * auVar249._0_4_;
              fVar380 = fVar364 * fVar480;
              fVar423 = fVar405 * fVar445;
              fVar470 = fVar411 * fVar342;
              fVar471 = fVar380 + fVar257 * fVar476 + fVar423;
              fVar478 = fVar380 + fVar380 + fVar470;
              fVar423 = fVar380 + fVar423 + fVar423;
              fVar470 = fVar380 + fVar470 + fVar470;
              fVar380 = (SQRT(auVar417._0_4_) + 1.0) * (fVar466 / SQRT(fVar339)) +
                        SQRT(auVar417._0_4_) * fVar466 + fVar306;
              fStack_520 = fVar445 * -fVar383;
              fStack_524 = fVar342 * -fVar421;
              local_528 = fStack_520 + fVar480 * -fVar419 + fVar476 * -fVar413 +
                          fVar229 * (fVar339 * fVar387 - fVar475 * fVar383) * fVar234 * fVar405 +
                          fVar229 * (fVar339 * fVar260 - fVar475 * fVar419) * fVar234 * fVar364 +
                          fVar229 * (fVar339 * fVar259 - fVar475 * fVar413) * fVar234 * fVar257;
              fVar259 = fVar282 * fVar445 + (float)local_5c8._4_4_ * fVar480 + fVar256 * fVar476;
              fVar229 = auVar417._0_4_ - fVar471 * fVar471;
              auVar180._0_8_ = CONCAT44(auVar417._4_4_ - fVar478 * fVar478,fVar229);
              auVar180._8_4_ = auVar417._8_4_ - fVar423 * fVar423;
              auVar180._12_4_ = auVar417._12_4_ - fVar470 * fVar470;
              fVar260 = -fVar421 * fVar411;
              fVar339 = fVar471 * local_528;
              auVar214._8_4_ = auVar180._8_4_;
              auVar214._0_8_ = auVar180._0_8_;
              auVar214._12_4_ = auVar180._12_4_;
              auVar249 = rsqrtss(auVar214,auVar180);
              fVar234 = auVar249._0_4_;
              fVar234 = fVar234 * 1.5 - fVar234 * fVar234 * fVar229 * 0.5 * fVar234;
              fStack_51c = fStack_524;
              if (fVar229 < 0.0) {
                local_518 = fVar446;
                uStack_514 = fVar450;
                fVar229 = sqrtf(fVar229);
                lVar114 = extraout_RAX;
                uVar117 = extraout_RDX;
                fVar446 = local_518;
                fVar450 = uStack_514;
              }
              else {
                fVar229 = SQRT(fVar229);
              }
              fVar229 = fVar229 - fVar230;
              fVar230 = ((-fVar383 * fVar405 + -fVar419 * fVar364 + -fVar413 * fVar257) - fVar339) *
                        fVar234 - fVar421;
              fVar234 = ((fVar282 * fVar405 + (float)local_5c8._4_4_ * fVar364 + fVar256 * fVar257)
                        - fVar471 * fVar259) * fVar234;
              auVar461._0_8_ = CONCAT44(fVar260,fVar230) ^ 0x8000000080000000;
              auVar327._4_4_ = fStack_524;
              auVar327._0_4_ = local_528;
              auVar271._0_4_ = local_528 * fVar234 - fVar259 * fVar230;
              auVar461._8_4_ = -fVar260;
              auVar461._12_4_ = fVar411 * 0.0;
              auVar460._8_8_ = auVar461._8_8_;
              auVar460._0_8_ = CONCAT44(fVar234,fVar230) ^ 0x80000000;
              auVar271._4_4_ = auVar271._0_4_;
              auVar271._8_4_ = auVar271._0_4_;
              auVar271._12_4_ = auVar271._0_4_;
              auVar399 = divps(auVar460,auVar271);
              auVar327._8_4_ = fStack_524;
              auVar327._12_4_ = -(fVar342 * 0.0);
              auVar326._8_8_ = auVar327._8_8_;
              auVar326._0_8_ = CONCAT44(fVar259,local_528) ^ 0x8000000000000000;
              auVar249 = divps(auVar326,auVar271);
              fStack_6b0 = auVar325._8_4_;
              fStack_6ac = auVar325._12_4_;
              auVar325._0_4_ = fVar376 - (fVar229 * auVar249._0_4_ + fVar471 * auVar399._0_4_);
              auVar325._4_4_ = fVar408 - (fVar229 * auVar249._4_4_ + fVar471 * auVar399._4_4_);
              auVar325._8_4_ = fStack_6b0 - (fVar229 * auVar249._8_4_ + fVar471 * auVar399._8_4_);
              auVar325._12_4_ = fStack_6ac - (fVar229 * auVar249._12_4_ + fVar471 * auVar399._12_4_)
              ;
              auVar249 = _DAT_01f46710;
              if (((float)((uint)fVar471 & (uint)DAT_01f46710) < fVar380) &&
                 ((float)((uint)fVar229 & (uint)DAT_01f46710) <
                  auVar324._12_4_ * 1.9073486e-06 + fVar306 + fVar380)) {
                bVar123 = uVar121 < 5;
                fVar466 = fVar362 + auVar325._0_4_;
                if (fVar466 < fVar261) {
                  lVar114 = 0;
                }
                else {
                  fVar306 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar306 < fVar466) {
                    lVar114 = 0;
                  }
                  else {
                    auVar328._4_4_ = auVar325._4_4_;
                    auVar328._0_4_ = auVar325._4_4_;
                    auVar328._8_4_ = auVar325._4_4_;
                    auVar328._12_4_ = auVar325._4_4_;
                    lVar114 = 0;
                    if ((0.0 <= auVar325._4_4_) && (auVar325._4_4_ <= 1.0)) {
                      auVar399 = rsqrtss(auVar417,auVar417);
                      fVar229 = auVar399._0_4_;
                      pGVar26 = (context->scene->geometries).items[uVar119].ptr;
                      if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        lVar114 = 0;
                        pRVar115 = (RTCIntersectArguments *)context;
                        uVar117 = uVar119;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (lVar114 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pRVar115 = (RTCIntersectArguments *)context, uVar117 = uVar119,
                              pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar229 = fVar229 * 1.5 +
                                  fVar229 * fVar229 * auVar417._0_4_ * -0.5 * fVar229;
                        fVar257 = fVar257 * fVar229;
                        fVar364 = fVar364 * fVar229;
                        fVar405 = fVar405 * fVar229;
                        fVar229 = fVar421 * fVar257 + fVar413;
                        fVar230 = fVar421 * fVar364 + fVar419;
                        fVar339 = fVar421 * fVar405 + fVar383;
                        fVar234 = fVar364 * fVar413 - fVar419 * fVar257;
                        fVar259 = fVar405 * fVar419 - fVar383 * fVar364;
                        fVar257 = fVar257 * fVar383 - fVar413 * fVar405;
                        local_2b8 = fVar259 * fVar230 - fVar257 * fVar229;
                        local_2d8._4_4_ = fVar257 * fVar339 - fVar234 * fVar230;
                        local_2c8 = fVar234 * fVar229 - fVar259 * fVar339;
                        local_2d8._0_4_ = local_2d8._4_4_;
                        fStack_2d0 = (float)local_2d8._4_4_;
                        fStack_2cc = (float)local_2d8._4_4_;
                        fStack_2c4 = local_2c8;
                        fStack_2c0 = local_2c8;
                        fStack_2bc = local_2c8;
                        fStack_2b4 = local_2b8;
                        fStack_2b0 = local_2b8;
                        fStack_2ac = local_2b8;
                        local_2a8 = auVar328;
                        local_298 = 0;
                        uStack_294 = 0;
                        uStack_290 = 0;
                        uStack_28c = 0;
                        local_288 = CONCAT44(uVar128,uVar128);
                        uStack_280 = CONCAT44(uVar128,uVar128);
                        local_278 = CONCAT44(uVar126,uVar126);
                        uStack_270 = CONCAT44(uVar126,uVar126);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar466;
                        local_568 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        args.valid = (int *)local_568;
                        args.geometryUserPtr = pGVar26->userPtr;
                        args.context = context->user;
                        args.ray = (RTCRayN *)ray;
                        args.hit = (RTCHitN *)local_2d8;
                        args.N = 4;
                        p_Var29 = pGVar26->occlusionFilterN;
                        auVar482._8_8_ = &local_268;
                        auVar482._0_8_ = p_Var29;
                        pRVar115 = (RTCIntersectArguments *)context;
                        local_518 = fVar446;
                        uStack_514 = fVar450;
                        if (p_Var29 != (RTCFilterFunctionN)0x0) {
                          auVar482 = (*p_Var29)(&args);
                        }
                        uVar117 = auVar482._8_8_;
                        auVar215._0_4_ = -(uint)(local_568._0_4_ == 0);
                        auVar215._4_4_ = -(uint)(local_568._4_4_ == 0);
                        auVar215._8_4_ = -(uint)(local_568._8_4_ == 0);
                        auVar215._12_4_ = -(uint)(local_568._12_4_ == 0);
                        uVar109 = movmskps(auVar482._0_4_,auVar215);
                        pRVar113 = (RTCRayN *)(ulong)(uVar109 ^ 0xf);
                        if ((uVar109 ^ 0xf) == 0) {
                          auVar215 = auVar215 ^ _DAT_01f46b70;
                          auVar249 = _DAT_01f46710;
                          fVar446 = local_518;
                          fVar450 = uStack_514;
                        }
                        else {
                          pRVar115 = context->args;
                          if (((RTCIntersectArguments *)pRVar115->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar115->flags & 2) != 0 ||
                              (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                            (*(code *)pRVar115->filter)(&args);
                            uVar117 = extraout_RDX_00;
                          }
                          auVar249 = _DAT_01f46710;
                          auVar181._0_4_ = -(uint)(local_568._0_4_ == 0);
                          auVar181._4_4_ = -(uint)(local_568._4_4_ == 0);
                          auVar181._8_4_ = -(uint)(local_568._8_4_ == 0);
                          auVar181._12_4_ = -(uint)(local_568._12_4_ == 0);
                          auVar215 = auVar181 ^ _DAT_01f46b70;
                          *(undefined1 (*) [16])(args.ray + 0x80) =
                               ~auVar181 & _DAT_01f45a40 |
                               *(undefined1 (*) [16])(args.ray + 0x80) & auVar181;
                          pRVar113 = args.ray;
                          fVar446 = local_518;
                          fVar450 = uStack_514;
                        }
                        auVar216._0_4_ = auVar215._0_4_ << 0x1f;
                        auVar216._4_4_ = auVar215._4_4_ << 0x1f;
                        auVar216._8_4_ = auVar215._8_4_ << 0x1f;
                        auVar216._12_4_ = auVar215._12_4_ << 0x1f;
                        iVar133 = movmskps((int)pRVar113,auVar216);
                        lVar114 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar113 >> 0x20),iVar133)
                                                 >> 8),iVar133 != 0);
                        if (iVar133 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar306;
                        }
                      }
                    }
                  }
                }
                goto LAB_003c1019;
              }
            }
            bVar123 = false;
LAB_003c1019:
            bVar122 = bVar122 | bVar123 & (byte)lVar114;
            fVar134 = *(float *)(ray + k * 4 + 0x80);
            auVar178._0_4_ = -(uint)(local_538 <= fVar134) & local_2e8._0_4_;
            auVar178._4_4_ = -(uint)(fStack_534 <= fVar134) & local_2e8._4_4_;
            auVar178._8_4_ = -(uint)(fStack_530 <= fVar134) & local_2e8._8_4_;
            auVar178._12_4_ = -(uint)(fStack_52c <= fVar134) & local_2e8._12_4_;
          }
          auVar253._0_4_ = -(uint)(aVar373.v[0] + local_548 <= fVar134) & uVar366;
          auVar253._4_4_ = -(uint)(aVar373.v[1] + fStack_544 <= fVar134) & uVar378;
          auVar253._8_4_ = -(uint)(aVar373.v[2] + fStack_540 <= fVar134) & uVar382;
          auVar253._12_4_ = -(uint)(aVar373.v[3] + fStack_53c <= fVar134) & uVar385;
          auVar182._0_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_5f8._0_4_ * fVar258 +
                                                           fVar453 * (float)local_5c8._4_4_ +
                                                           fVar468 * fVar282) & uVar388)) &
                             local_638._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar182._4_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_5f8._4_4_ * fVar258 +
                                                           fVar454 * (float)local_5c8._4_4_ +
                                                           fVar195 * fVar282) & uVar406)) &
                             local_638._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar182._8_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= (float)((uint)(fStack_5f0 * fVar258 +
                                                           fVar455 * (float)local_5c8._4_4_ +
                                                           fVar197 * fVar282) & uVar409)) &
                             uStack_630) << 0x1f) >> 0x1f) + 4);
          auVar182._12_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= (float)((uint)(fStack_5ec * fVar258 +
                                                           fVar464 * (float)local_5c8._4_4_ +
                                                           fVar198 * fVar282) & uVar412)) &
                             uStack_62c) << 0x1f) >> 0x1f) + 4);
          auVar183 = ~auVar182 & auVar253;
          local_538 = local_548 + tp1.lower.field_0.v[0];
          fStack_534 = fStack_544 + tp1.lower.field_0.v[1];
          fStack_530 = fStack_540 + tp1.lower.field_0.v[2];
          fStack_52c = fStack_53c + tp1.lower.field_0.v[3];
          while( true ) {
            uStack_514._2_2_ = (undefined2)((uint)fVar450 >> 0x10);
            uStack_514._0_2_ = SUB42(fVar450,0);
            local_2f8 = auVar183;
            iVar133 = movmskps((int)lVar114,auVar183);
            if (iVar133 == 0) break;
            auVar399 = ~auVar183 & _DAT_01f45a30 | auVar183 & (undefined1  [16])vVar107.field_0;
            auVar272._4_4_ = auVar399._0_4_;
            auVar272._0_4_ = auVar399._4_4_;
            auVar272._8_4_ = auVar399._12_4_;
            auVar272._12_4_ = auVar399._8_4_;
            auVar310 = minps(auVar272,auVar399);
            auVar217._0_8_ = auVar310._8_8_;
            auVar217._8_4_ = auVar310._0_4_;
            auVar217._12_4_ = auVar310._4_4_;
            auVar310 = minps(auVar217,auVar310);
            auVar218._0_8_ =
                 CONCAT44(-(uint)(auVar310._4_4_ == auVar399._4_4_) & auVar183._4_4_,
                          -(uint)(auVar310._0_4_ == auVar399._0_4_) & auVar183._0_4_);
            auVar218._8_4_ = -(uint)(auVar310._8_4_ == auVar399._8_4_) & auVar183._8_4_;
            auVar218._12_4_ = -(uint)(auVar310._12_4_ == auVar399._12_4_) & auVar183._12_4_;
            iVar133 = movmskps(iVar133,auVar218);
            if (iVar133 != 0) {
              auVar183._8_4_ = auVar218._8_4_;
              auVar183._0_8_ = auVar218._0_8_;
              auVar183._12_4_ = auVar218._12_4_;
            }
            uVar110 = movmskps(iVar133,auVar183);
            uVar121 = CONCAT44((int)((ulong)lVar114 >> 0x20),uVar110);
            lVar114 = 0;
            if (uVar121 != 0) {
              for (; (uVar121 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
              }
            }
            *(undefined4 *)(local_2f8 + lVar114 * 4) = 0;
            auVar75._4_2_ = (undefined2)uStack_514;
            auVar75._0_4_ = fVar446;
            auVar75._6_2_ = uStack_514._2_2_;
            auVar75._8_4_ = fStack_510;
            auVar75._12_4_ = fStack_50c;
            auVar79._4_4_ = fVar379;
            auVar79._0_4_ = fVar375;
            auVar79._8_4_ = fVar386;
            auVar79._12_4_ = fVar404;
            auVar399 = minps(auVar75,auVar79);
            auVar474 = maxps(auVar75,auVar79);
            auVar77._4_4_ = fVar418;
            auVar77._0_4_ = fVar341;
            auVar77._8_4_ = fVar407;
            auVar77._12_4_ = fVar429;
            auVar310 = minps(auVar77,_local_618);
            auVar399 = minps(auVar399,auVar310);
            auVar310 = maxps(auVar77,_local_618);
            auVar474 = maxps(auVar474,auVar310);
            auVar273._0_4_ = auVar399._0_4_ & auVar249._0_4_;
            auVar273._4_4_ = auVar399._4_4_ & auVar249._4_4_;
            auVar273._8_4_ = auVar399._8_4_ & auVar249._8_4_;
            auVar273._12_4_ = auVar399._12_4_ & auVar249._12_4_;
            auVar184._0_4_ = auVar474._0_4_ & auVar249._0_4_;
            auVar184._4_4_ = auVar474._4_4_ & auVar249._4_4_;
            auVar184._8_4_ = auVar474._8_4_ & auVar249._8_4_;
            auVar184._12_4_ = (uint)auVar474._12_4_ & auVar249._12_4_;
            auVar310 = maxps(auVar273,auVar184);
            fVar453 = auVar310._4_4_;
            if (auVar310._4_4_ <= auVar310._0_4_) {
              fVar453 = auVar310._0_4_;
            }
            auVar274._8_8_ = auVar310._8_8_;
            auVar274._0_8_ = auVar310._8_8_;
            if (auVar310._8_4_ <= fVar453) {
              auVar274._0_4_ = fVar453;
            }
            fVar453 = auVar274._0_4_ * 1.9073486e-06;
            auVar329._4_4_ = local_118[lVar114];
            auVar329._0_4_ = (float)tp1.upper.field_0.i[lVar114];
            auVar329._8_8_ = 0;
            for (uVar121 = 0; uVar121 != 5; uVar121 = uVar121 + 1) {
              fVar230 = auVar329._0_4_;
              fVar339 = auVar329._4_4_;
              fVar455 = SQRT(fVar304) * 1.9073486e-06 * fVar230;
              fVar466 = 1.0 - fVar339;
              fVar464 = fVar339 * 3.0;
              fVar454 = -fVar339 * fVar466 * fVar466 * 0.5;
              fVar195 = (fVar339 * fVar339 * (fVar464 + -5.0) + 2.0) * 0.5;
              fVar468 = ((fVar466 * 3.0 + -5.0) * fVar466 * fVar466 + 2.0) * 0.5;
              fVar197 = -fVar466 * fVar339 * fVar339 * 0.5;
              local_528 = fVar454 * fVar446 +
                          fVar195 * fVar375 + fVar468 * fVar341 + fVar197 * (float)local_618._0_4_;
              fStack_524 = fVar454 * fVar450 +
                           fVar195 * fVar379 + fVar468 * fVar418 + fVar197 * fVar353;
              fStack_520 = fVar454 * fStack_510 +
                           fVar195 * fVar386 + fVar468 * fVar407 + fVar197 * fStack_610;
              fStack_51c = fVar454 * fStack_50c +
                           fVar195 * fVar404 + fVar468 * fVar429 + fVar197 * fStack_60c;
              fVar197 = (fVar339 * (fVar466 + fVar466) - fVar466 * fVar466) * 0.5;
              fVar195 = ((fVar339 + fVar339) * (fVar464 + -5.0) + fVar339 * fVar464) * 0.5;
              fVar468 = ((fVar464 + 2.0) * (fVar466 + fVar466) + fVar466 * -3.0 * fVar466) * 0.5;
              fVar454 = (fVar466 * -2.0 * fVar339 + fVar339 * fVar339) * 0.5;
              fVar257 = fVar197 * fVar446 +
                        fVar195 * fVar375 + fVar468 * fVar341 + fVar454 * (float)local_618._0_4_;
              fVar259 = fVar197 * fVar450 +
                        fVar195 * fVar379 + fVar468 * fVar418 + fVar454 * fVar353;
              fVar260 = fVar197 * fStack_510 +
                        fVar195 * fVar386 + fVar468 * fVar407 + fVar454 * fStack_610;
              fVar364 = fVar197 * fStack_50c +
                        fVar195 * fVar404 + fVar468 * fVar429 + fVar454 * fStack_60c;
              fVar466 = fVar339 * -3.0 + 2.0;
              fVar195 = fVar339 * 9.0 + -5.0;
              fVar454 = fVar339 * -9.0 + 4.0;
              fVar464 = fVar464 + -1.0;
              fVar468 = fVar466 * fVar446 +
                        fVar195 * fVar375 + fVar454 * fVar341 + fVar464 * (float)local_618._0_4_;
              fVar197 = fVar466 * fVar450 +
                        fVar195 * fVar379 + fVar454 * fVar418 + fVar464 * fVar353;
              fVar306 = fVar466 * fStack_510 +
                        fVar195 * fVar386 + fVar454 * fVar407 + fVar464 * fStack_610;
              fVar195 = (fVar230 * fVar256 + 0.0) - local_528;
              fVar198 = (fVar230 * (float)local_5c8._4_4_ + 0.0) - fStack_524;
              fVar229 = (fVar230 * fVar282 + 0.0) - fStack_520;
              fVar234 = (fVar230 * 0.0 + 0.0) - fStack_51c;
              fVar454 = fVar198 * fVar198;
              fVar464 = fVar229 * fVar229;
              fVar466 = fVar234 * fVar234;
              auVar361._0_4_ = fVar454 + fVar195 * fVar195 + fVar464;
              auVar361._4_4_ = fVar454 + fVar454 + fVar466;
              auVar361._8_4_ = fVar454 + fVar464 + fVar464;
              auVar361._12_4_ = fVar454 + fVar466 + fVar466;
              fVar454 = fVar453;
              if (fVar453 <= fVar455) {
                fVar454 = fVar455;
              }
              fVar464 = fVar259 * fVar259 + fVar257 * fVar257 + fVar260 * fVar260;
              auVar249 = ZEXT416((uint)fVar464);
              auVar310 = rsqrtss(ZEXT416((uint)fVar464),auVar249);
              fVar455 = auVar310._0_4_;
              fVar466 = fVar455 * 1.5 - fVar455 * fVar455 * fVar464 * 0.5 * fVar455;
              fVar411 = fVar257 * fVar466;
              fVar380 = fVar259 * fVar466;
              fVar413 = fVar260 * fVar466;
              fVar419 = fVar364 * fVar466;
              fVar408 = fVar306 * fVar260 + fVar197 * fVar259 + fVar468 * fVar257;
              auVar310 = rcpss(auVar249,auVar249);
              fVar455 = (2.0 - fVar464 * auVar310._0_4_) * auVar310._0_4_;
              fVar387 = fVar198 * fVar380;
              fVar405 = fVar229 * fVar413;
              fVar376 = fVar234 * fVar419;
              fVar383 = fVar387 + fVar195 * fVar411 + fVar405;
              fVar421 = fVar387 + fVar387 + fVar376;
              fVar405 = fVar387 + fVar405 + fVar405;
              fVar376 = fVar387 + fVar376 + fVar376;
              fVar387 = (SQRT(auVar361._0_4_) + 1.0) * (fVar453 / SQRT(fVar464)) +
                        SQRT(auVar361._0_4_) * fVar453 + fVar454;
              local_638._4_4_ = fVar419 * -fVar364;
              local_638._0_4_ =
                   fVar413 * -fVar260 + fVar380 * -fVar259 + fVar411 * -fVar257 +
                   fVar455 * (fVar464 * fVar306 - fVar408 * fVar260) * fVar466 * fVar229 +
                   fVar455 * (fVar464 * fVar197 - fVar408 * fVar259) * fVar466 * fVar198 +
                   fVar455 * (fVar464 * fVar468 - fVar408 * fVar257) * fVar466 * fVar195;
              fVar466 = fVar282 * fVar413 + (float)local_5c8._4_4_ * fVar380 + fVar256 * fVar411;
              fVar455 = auVar361._0_4_ - fVar383 * fVar383;
              auVar185._0_8_ = CONCAT44(auVar361._4_4_ - fVar421 * fVar421,fVar455);
              auVar185._8_4_ = auVar361._8_4_ - fVar405 * fVar405;
              auVar185._12_4_ = auVar361._12_4_ - fVar376 * fVar376;
              fVar468 = -fVar364 * fVar234;
              auVar219._8_4_ = auVar185._8_4_;
              auVar219._0_8_ = auVar185._0_8_;
              auVar219._12_4_ = auVar185._12_4_;
              auVar310 = rsqrtss(auVar219,auVar185);
              fVar464 = auVar310._0_4_;
              fVar464 = fVar464 * 1.5 - fVar464 * fVar464 * fVar455 * 0.5 * fVar464;
              if (fVar455 < 0.0) {
                local_518 = fVar446;
                uStack_514 = fVar450;
                fVar455 = sqrtf(fVar455);
                lVar114 = extraout_RAX_00;
                uVar117 = extraout_RDX_01;
                fVar446 = local_518;
                fVar450 = uStack_514;
              }
              else {
                fVar455 = SQRT(fVar455);
              }
              fVar455 = fVar455 - fStack_51c;
              fVar197 = ((-fVar260 * fVar229 + -fVar259 * fVar198 + -fVar257 * fVar195) -
                        fVar383 * (float)local_638._0_4_) * fVar464 - fVar364;
              fVar464 = ((fVar282 * fVar229 + (float)local_5c8._4_4_ * fVar198 + fVar256 * fVar195)
                        - fVar383 * fVar466) * fVar464;
              auVar463._0_8_ = CONCAT44(fVar468,fVar197) ^ 0x8000000080000000;
              auVar275._0_4_ = (float)local_638._0_4_ * fVar464 - fVar466 * fVar197;
              auVar463._8_4_ = -fVar468;
              auVar463._12_4_ = fVar234 * 0.0;
              auVar462._8_8_ = auVar463._8_8_;
              auVar462._0_8_ = CONCAT44(fVar464,fVar197) ^ 0x80000000;
              auVar275._4_4_ = auVar275._0_4_;
              auVar275._8_4_ = auVar275._0_4_;
              auVar275._12_4_ = auVar275._0_4_;
              auVar249 = divps(auVar462,auVar275);
              auVar331._8_4_ = local_638._4_4_;
              auVar331._0_8_ = local_638;
              auVar331._12_4_ = -(fVar419 * 0.0);
              auVar330._8_8_ = auVar331._8_8_;
              auVar330._0_8_ = CONCAT44(fVar466,local_638._0_4_) ^ 0x8000000000000000;
              auVar310 = divps(auVar330,auVar275);
              fStack_660 = auVar329._8_4_;
              fStack_65c = auVar329._12_4_;
              auVar329._0_4_ = fVar230 - (fVar455 * auVar310._0_4_ + fVar383 * auVar249._0_4_);
              auVar329._4_4_ = fVar339 - (fVar455 * auVar310._4_4_ + fVar383 * auVar249._4_4_);
              auVar329._8_4_ = fStack_660 - (fVar455 * auVar310._8_4_ + fVar383 * auVar249._8_4_);
              auVar329._12_4_ = fStack_65c - (fVar455 * auVar310._12_4_ + fVar383 * auVar249._12_4_)
              ;
              auVar249 = _DAT_01f46710;
              if (((float)((uint)fVar383 & (uint)DAT_01f46710) < fVar387) &&
                 ((float)((uint)fVar455 & (uint)DAT_01f46710) <
                  auVar474._12_4_ * 1.9073486e-06 + fVar454 + fVar387)) {
                bVar123 = uVar121 < 5;
                fVar453 = fVar362 + auVar329._0_4_;
                if ((fVar453 < fVar261) ||
                   (fVar454 = *(float *)(ray + k * 4 + 0x80), fVar454 < fVar453)) {
                  lVar114 = 0;
                }
                else {
                  auVar332._4_4_ = auVar329._4_4_;
                  auVar332._0_4_ = auVar329._4_4_;
                  auVar332._8_4_ = auVar329._4_4_;
                  auVar332._12_4_ = auVar329._4_4_;
                  lVar114 = 0;
                  if ((0.0 <= auVar329._4_4_) && (auVar329._4_4_ <= 1.0)) {
                    auVar310 = rsqrtss(auVar361,auVar361);
                    fVar455 = auVar310._0_4_;
                    pGVar26 = (context->scene->geometries).items[uVar119].ptr;
                    if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      lVar114 = 0;
                      pRVar115 = (RTCIntersectArguments *)context;
                      uVar117 = uVar119;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (lVar114 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pRVar115 = (RTCIntersectArguments *)context, uVar117 = uVar119,
                            pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar455 = fVar455 * 1.5 + fVar455 * fVar455 * auVar361._0_4_ * -0.5 * fVar455;
                      fVar195 = fVar195 * fVar455;
                      fVar198 = fVar198 * fVar455;
                      fVar229 = fVar229 * fVar455;
                      fVar455 = fVar364 * fVar195 + fVar257;
                      fVar464 = fVar364 * fVar198 + fVar259;
                      fVar466 = fVar364 * fVar229 + fVar260;
                      fVar468 = fVar198 * fVar257 - fVar259 * fVar195;
                      fVar197 = fVar229 * fVar259 - fVar260 * fVar198;
                      fVar195 = fVar195 * fVar260 - fVar257 * fVar229;
                      local_2b8 = fVar197 * fVar464 - fVar195 * fVar455;
                      local_2d8._4_4_ = fVar195 * fVar466 - fVar468 * fVar464;
                      local_2c8 = fVar468 * fVar455 - fVar197 * fVar466;
                      local_2d8._0_4_ = local_2d8._4_4_;
                      fStack_2d0 = (float)local_2d8._4_4_;
                      fStack_2cc = (float)local_2d8._4_4_;
                      fStack_2c4 = local_2c8;
                      fStack_2c0 = local_2c8;
                      fStack_2bc = local_2c8;
                      fStack_2b4 = local_2b8;
                      fStack_2b0 = local_2b8;
                      fStack_2ac = local_2b8;
                      local_2a8 = auVar332;
                      local_298 = 0;
                      uStack_294 = 0;
                      uStack_290 = 0;
                      uStack_28c = 0;
                      local_288 = CONCAT44(uVar128,uVar128);
                      uStack_280 = CONCAT44(uVar128,uVar128);
                      local_278 = CONCAT44(uVar126,uVar126);
                      uStack_270 = CONCAT44(uVar126,uVar126);
                      local_268 = context->user->instID[0];
                      uStack_264 = local_268;
                      uStack_260 = local_268;
                      uStack_25c = local_268;
                      local_258 = context->user->instPrimID[0];
                      uStack_254 = local_258;
                      uStack_250 = local_258;
                      uStack_24c = local_258;
                      *(float *)(ray + k * 4 + 0x80) = fVar453;
                      local_568 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                      args.valid = (int *)local_568;
                      args.geometryUserPtr = pGVar26->userPtr;
                      args.context = context->user;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)local_2d8;
                      args.N = 4;
                      p_Var29 = pGVar26->occlusionFilterN;
                      auVar483._8_8_ = &local_268;
                      auVar483._0_8_ = p_Var29;
                      pRVar115 = (RTCIntersectArguments *)context;
                      local_518 = fVar446;
                      uStack_514 = fVar450;
                      if (p_Var29 != (RTCFilterFunctionN)0x0) {
                        auVar483 = (*p_Var29)(&args);
                      }
                      uVar117 = auVar483._8_8_;
                      auVar220._0_4_ = -(uint)(local_568._0_4_ == 0);
                      auVar220._4_4_ = -(uint)(local_568._4_4_ == 0);
                      auVar220._8_4_ = -(uint)(local_568._8_4_ == 0);
                      auVar220._12_4_ = -(uint)(local_568._12_4_ == 0);
                      uVar366 = movmskps(auVar483._0_4_,auVar220);
                      pRVar113 = (RTCRayN *)(ulong)(uVar366 ^ 0xf);
                      if ((uVar366 ^ 0xf) == 0) {
                        auVar220 = auVar220 ^ _DAT_01f46b70;
                        auVar249 = _DAT_01f46710;
                        fVar446 = local_518;
                        fVar450 = uStack_514;
                      }
                      else {
                        pRVar115 = context->args;
                        if (((RTCIntersectArguments *)pRVar115->filter !=
                             (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar115->flags & 2) != 0 ||
                            (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                          (*(code *)pRVar115->filter)(&args);
                          uVar117 = extraout_RDX_02;
                        }
                        auVar249 = _DAT_01f46710;
                        auVar186._0_4_ = -(uint)(local_568._0_4_ == 0);
                        auVar186._4_4_ = -(uint)(local_568._4_4_ == 0);
                        auVar186._8_4_ = -(uint)(local_568._8_4_ == 0);
                        auVar186._12_4_ = -(uint)(local_568._12_4_ == 0);
                        auVar220 = auVar186 ^ _DAT_01f46b70;
                        *(undefined1 (*) [16])(args.ray + 0x80) =
                             ~auVar186 & _DAT_01f45a40 |
                             *(undefined1 (*) [16])(args.ray + 0x80) & auVar186;
                        pRVar113 = args.ray;
                        fVar446 = local_518;
                        fVar450 = uStack_514;
                      }
                      auVar221._0_4_ = auVar220._0_4_ << 0x1f;
                      auVar221._4_4_ = auVar220._4_4_ << 0x1f;
                      auVar221._8_4_ = auVar220._8_4_ << 0x1f;
                      auVar221._12_4_ = auVar220._12_4_ << 0x1f;
                      iVar133 = movmskps((int)pRVar113,auVar221);
                      lVar114 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar113 >> 0x20),iVar133) >>
                                               8),iVar133 != 0);
                      if (iVar133 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar454;
                      }
                    }
                  }
                }
                goto LAB_003c1b9c;
              }
            }
            bVar123 = false;
LAB_003c1b9c:
            bVar122 = bVar122 | bVar123 & (byte)lVar114;
            fVar134 = *(float *)(ray + k * 4 + 0x80);
            auVar183._0_4_ = -(uint)(local_538 <= fVar134) & local_2f8._0_4_;
            auVar183._4_4_ = -(uint)(fStack_534 <= fVar134) & local_2f8._4_4_;
            auVar183._8_4_ = -(uint)(fStack_530 <= fVar134) & local_2f8._8_4_;
            auVar183._12_4_ = -(uint)(fStack_52c <= fVar134) & local_2f8._12_4_;
          }
          auVar300._0_4_ = local_558._0_4_ & uVar125 & -(uint)(local_548 + fVar451 <= fVar134);
          auVar300._4_4_ = local_558._4_4_ & uVar127 & -(uint)(fStack_544 + fVar227 <= fVar134);
          auVar300._8_4_ = (uint)fStack_550 & uVar129 & -(uint)(fStack_540 + fVar336 <= fVar134);
          auVar300._12_4_ = (uint)fStack_54c & uVar131 & -(uint)(fStack_53c + fVar338 <= fVar134);
          auVar276._0_4_ =
               auVar182._0_4_ & auVar253._0_4_ &
               -(uint)(local_548 + tp1.lower.field_0.v[0] <= fVar134);
          auVar276._4_4_ =
               auVar182._4_4_ & auVar253._4_4_ &
               -(uint)(fStack_544 + tp1.lower.field_0.v[1] <= fVar134);
          auVar276._8_4_ =
               auVar182._8_4_ & auVar253._8_4_ &
               -(uint)(fStack_540 + tp1.lower.field_0.v[2] <= fVar134);
          auVar276._12_4_ =
               auVar182._12_4_ & auVar253._12_4_ &
               -(uint)(fStack_53c + tp1.lower.field_0.v[3] <= fVar134);
          iVar133 = movmskps(0,auVar276 | auVar300);
          pRVar116 = pRVar115;
          fVar466 = local_548;
          fVar306 = fStack_544;
          fVar229 = fStack_540;
          fVar230 = fStack_53c;
          if (iVar133 != 0) {
            stack[uVar130].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar276 | auVar300);
            auVar187._0_4_ = (uint)fVar451 & auVar300._0_4_;
            auVar187._4_4_ = (uint)fVar227 & auVar300._4_4_;
            auVar187._8_4_ = (uint)fVar336 & auVar300._8_4_;
            auVar187._12_4_ = (uint)fVar338 & auVar300._12_4_;
            auVar301._0_4_ = ~auVar300._0_4_ & tp1.lower.field_0.i[0];
            auVar301._4_4_ = ~auVar300._4_4_ & tp1.lower.field_0.i[1];
            auVar301._8_4_ = ~auVar300._8_4_ & tp1.lower.field_0.i[2];
            auVar301._12_4_ = ~auVar300._12_4_ & tp1.lower.field_0.i[3];
            stack[uVar130].tlower.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar301 | auVar187);
            stack[uVar130].u0 = fVar283;
            stack[uVar130].u1 = fVar284;
            stack[uVar130].depth = uVar118 + 1;
            uVar130 = uVar130 + 1;
          }
        }
      }
    }
    do {
      uVar125 = uVar130;
      if (uVar125 == 0) {
        if (bVar122 != 0) goto LAB_003c21ea;
        fVar256 = *(float *)(ray + k * 4 + 0x80);
        auVar225._4_4_ = -(uint)(fVar226 <= fVar256);
        auVar225._0_4_ = -(uint)(fVar200 <= fVar256);
        auVar225._8_4_ = -(uint)(fVar228 <= fVar256);
        auVar225._12_4_ = -(uint)(fVar233 <= fVar256);
        uVar126 = movmskps((int)pRVar116,auVar225);
        uVar124 = uVar124 - 1 & uVar124 & uVar126;
        goto LAB_003bf5da;
      }
      uVar130 = uVar125 - 1;
      pRVar116 = (RTCIntersectArguments *)(ulong)uVar130;
      fVar284 = stack[(long)pRVar116].tlower.field_0.v[0];
      fVar451 = stack[(long)pRVar116].tlower.field_0.v[1];
      fVar453 = stack[(long)pRVar116].tlower.field_0.v[2];
      fVar454 = stack[(long)pRVar116].tlower.field_0.v[3];
      fVar283 = *(float *)(ray + k * 4 + 0x80);
      aVar188._0_4_ =
           -(uint)(fVar466 + fVar284 <= fVar283) & stack[(long)pRVar116].valid.field_0.i[0];
      aVar188._4_4_ =
           -(uint)(fVar306 + fVar451 <= fVar283) & stack[(long)pRVar116].valid.field_0.i[1];
      aVar188.i[2] = -(uint)(fVar229 + fVar453 <= fVar283) &
                     stack[(long)pRVar116].valid.field_0.i[2];
      aVar188.i[3] = -(uint)(fVar230 + fVar454 <= fVar283) &
                     stack[(long)pRVar116].valid.field_0.i[3];
      _local_2d8 = aVar188;
      uVar127 = movmskps((int)uVar117,(undefined1  [16])aVar188);
      uVar117 = (ulong)uVar127;
    } while (uVar127 == 0);
    auVar222._0_4_ = (uint)fVar284 & aVar188._0_4_;
    auVar222._4_4_ = (uint)fVar451 & aVar188._4_4_;
    auVar222._8_4_ = (uint)fVar453 & aVar188.i[2];
    auVar222._12_4_ = (uint)fVar454 & aVar188.i[3];
    auVar254._0_8_ = CONCAT44(~aVar188._4_4_,~aVar188._0_4_) & 0x7f8000007f800000;
    auVar254._8_4_ = ~aVar188.i[2] & 0x7f800000;
    auVar254._12_4_ = ~aVar188.i[3] & 0x7f800000;
    auVar254 = auVar254 | auVar222;
    auVar277._4_4_ = auVar254._0_4_;
    auVar277._0_4_ = auVar254._4_4_;
    auVar277._8_4_ = auVar254._12_4_;
    auVar277._12_4_ = auVar254._8_4_;
    auVar310 = minps(auVar277,auVar254);
    auVar223._0_8_ = auVar310._8_8_;
    auVar223._8_4_ = auVar310._0_4_;
    auVar223._12_4_ = auVar310._4_4_;
    auVar310 = minps(auVar223,auVar310);
    auVar224._0_8_ =
         CONCAT44(-(uint)(auVar310._4_4_ == auVar254._4_4_) & aVar188._4_4_,
                  -(uint)(auVar310._0_4_ == auVar254._0_4_) & aVar188._0_4_);
    auVar224._8_4_ = -(uint)(auVar310._8_4_ == auVar254._8_4_) & aVar188.i[2];
    auVar224._12_4_ = -(uint)(auVar310._12_4_ == auVar254._12_4_) & aVar188.i[3];
    iVar133 = movmskps(uVar130,auVar224);
    if (iVar133 != 0) {
      aVar188.i[2] = auVar224._8_4_;
      aVar188._0_8_ = auVar224._0_8_;
      aVar188.i[3] = auVar224._12_4_;
    }
    pSVar112 = stack + (long)pRVar116;
    uVar130 = movmskps(iVar133,(undefined1  [16])aVar188);
    pRVar115 = (RTCIntersectArguments *)0x0;
    if (uVar130 != 0) {
      for (; (uVar130 >> (long)pRVar115 & 1) == 0;
          pRVar115 = (RTCIntersectArguments *)((long)&pRVar115->flags + 1)) {
      }
    }
    *(undefined4 *)(local_2d8 + (long)pRVar115 * 4) = 0;
    uVar8 = stack[(long)pRVar116].u0;
    uVar17 = stack[(long)pRVar116].u1;
    uVar118 = stack[(long)pRVar116].depth;
    iVar133 = movmskps(uVar127,(undefined1  [16])_local_2d8);
    uVar130 = uVar125 - 1;
    if (iVar133 != 0) {
      uVar130 = uVar125;
    }
    uVar117 = (ulong)uVar130;
    (pSVar112->valid).field_0 = _local_2d8;
    fVar283 = (float)uVar17 - (float)uVar8;
    args.valid = (int *)CONCAT44(fVar283 * 0.33333334 + (float)uVar8,fVar283 * 0.0 + (float)uVar8);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar283 * 1.0 + (float)uVar8,fVar283 * 0.6666667 + (float)uVar8);
    fVar283 = *(float *)((long)&args.valid + (long)pRVar115 * 4);
    fVar284 = *(float *)((long)&args.valid + (long)pRVar115 * 4 + 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }